

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::BNLL_x86_avx::forward_inplace(BNLL_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  long *in_RSI;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  __m128 _x_1;
  __m128 _tmp_1;
  __m128 _abs_p_1;
  __m128 mask_3;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _x;
  __m256 _tmp;
  __m256 _abs_p;
  __m256 mask;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask_1;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf y_3;
  v4sf z_1;
  v4sf tmp_3;
  v4sf mask_5;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_3;
  v4si emm0_1;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_4;
  v4sf one_2;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_2;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 local_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined4 uStack_2ad4;
  undefined4 uStack_2ad0;
  undefined4 uStack_2acc;
  undefined4 uStack_2ac8;
  undefined4 uStack_2ac4;
  int local_2a78;
  undefined8 local_2a68;
  undefined8 local_2a60;
  undefined8 local_2a58;
  undefined4 local_2a50;
  long local_2a48;
  undefined4 local_2a40;
  undefined4 local_2a3c;
  undefined4 local_2a38;
  undefined4 local_2a34;
  undefined4 local_2a30;
  undefined8 local_2a28;
  undefined1 (*local_2a20) [32];
  int local_2a14;
  int local_2a10;
  int local_2a0c;
  int local_2a08;
  int local_2a04;
  int local_2a00;
  int local_29fc;
  long *local_29f0;
  undefined1 local_29dd;
  int local_29dc;
  undefined8 *local_29d0;
  undefined8 *local_29c8;
  undefined8 *local_29b8;
  undefined4 local_29a4;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 (*local_2948) [32];
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  int local_2900 [2];
  int aiStack_28f8 [2];
  int aiStack_28f0 [2];
  int aiStack_28e8 [2];
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined1 local_28c0 [8];
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [8];
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 local_2820 [32];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [8];
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined1 local_27a0 [32];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined1 local_24e0 [8];
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined1 local_23a0 [32];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  ulong uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 (*local_22a8) [32];
  undefined4 local_22a0;
  undefined4 uStack_229c;
  undefined4 uStack_2298;
  undefined4 uStack_2294;
  undefined4 local_2284;
  undefined1 local_2280 [16];
  undefined1 (*local_2268) [32];
  undefined8 local_2260;
  ulong uStack_2258;
  undefined8 local_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 local_2230;
  undefined8 uStack_2228;
  int local_2220 [2];
  int aiStack_2218 [2];
  undefined8 local_2210;
  undefined8 uStack_2208;
  undefined1 local_2200 [8];
  undefined8 uStack_21f8;
  float local_21f0;
  float fStack_21ec;
  float fStack_21e8;
  float fStack_21e4;
  undefined1 local_21e0 [16];
  undefined1 local_21d0 [16];
  undefined1 local_21c0 [8];
  undefined8 uStack_21b8;
  undefined1 local_21b0 [16];
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined1 local_2190 [16];
  undefined1 local_2180 [8];
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 local_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 local_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 local_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 local_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 local_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined1 local_2040 [16];
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined1 local_2020 [16];
  undefined1 local_2010 [8];
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined1 local_1ff0 [16];
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 local_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 local_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined1 local_1f30 [16];
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 local_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  ulong uStack_1ed8;
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  undefined1 (*local_1eb8) [32];
  long local_1eb0;
  undefined4 local_1ea4;
  long local_1ea0;
  undefined1 (*local_1e98) [32];
  undefined4 local_1e8c;
  int local_1e88;
  int local_1e84;
  undefined8 *local_1e80;
  undefined4 local_1e74;
  long local_1e70;
  undefined8 *local_1e50;
  undefined1 local_1e20 [16];
  undefined1 auStack_1e10 [16];
  undefined4 local_1e00;
  undefined4 local_1dfc;
  undefined4 local_1df8;
  undefined4 local_1df4;
  undefined4 local_1df0;
  undefined4 local_1dec;
  undefined4 local_1de8;
  undefined4 local_1de4;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined1 local_1cf0 [16];
  undefined1 local_1ce0 [16];
  undefined4 local_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [16];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined1 *local_1998;
  undefined8 *local_1990;
  undefined8 *local_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float *local_18f8;
  undefined1 *local_18f0;
  undefined8 *local_18e8;
  float local_18e0 [2];
  float afStack_18d8 [2];
  float afStack_18d0 [2];
  float afStack_18c8 [2];
  float local_18c0;
  float fStack_18bc;
  float fStack_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float fStack_18a8;
  float fStack_18a4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  float *local_1858;
  undefined1 *local_1850;
  undefined8 *local_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  float *local_17b8;
  undefined1 *local_17b0;
  undefined8 *local_17a8;
  float local_17a0 [2];
  float afStack_1798 [2];
  float afStack_1790 [2];
  float afStack_1788 [2];
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  float *local_1718;
  undefined1 *local_1710;
  undefined8 *local_1708;
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float *local_1678;
  undefined1 *local_1670;
  undefined8 *local_1668;
  float local_1660 [2];
  float afStack_1658 [2];
  float afStack_1650 [2];
  float afStack_1648 [2];
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float *local_15d8;
  float *local_15d0;
  undefined1 *local_15c8;
  float local_15c0 [2];
  float afStack_15b8 [2];
  float afStack_15b0 [2];
  float afStack_15a8 [2];
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  undefined4 uStack_1584;
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 *local_1538;
  float *local_1530;
  undefined1 *local_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  float local_14e0 [2];
  float afStack_14d8 [2];
  float afStack_14d0 [2];
  float afStack_14c8 [2];
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 *local_1498;
  float *local_1490;
  undefined1 *local_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440 [2];
  float afStack_1438 [2];
  float afStack_1430 [2];
  float afStack_1428 [2];
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float *local_13f8;
  undefined1 *local_13f0;
  undefined1 *local_13e8;
  float local_13e0 [2];
  float afStack_13d8 [2];
  float afStack_13d0 [2];
  float afStack_13c8 [2];
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  undefined4 uStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  undefined4 uStack_1364;
  float *local_1358;
  undefined1 *local_1350;
  undefined1 *local_1348;
  float local_1340 [2];
  float afStack_1338 [2];
  float afStack_1330 [2];
  float afStack_1328 [2];
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  undefined4 uStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float *local_12b8;
  undefined1 *local_12b0;
  undefined1 *local_12a8;
  float local_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float *local_1218;
  undefined1 *local_1210;
  undefined1 *local_1208;
  float local_1200 [2];
  float afStack_11f8 [2];
  float afStack_11f0 [2];
  float afStack_11e8 [2];
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  undefined4 uStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  float local_1160 [2];
  float afStack_1158 [2];
  float afStack_1150 [2];
  float afStack_1148 [2];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  float *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  float local_10c0 [2];
  float afStack_10b8 [2];
  float afStack_10b0 [2];
  float afStack_10a8 [2];
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  undefined4 uStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  float *local_1038;
  undefined1 *local_1030;
  undefined1 *local_1028;
  float local_1020 [2];
  float afStack_1018 [2];
  float afStack_1010 [2];
  float afStack_1008 [2];
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  undefined4 uStack_fa4;
  float *local_f98;
  undefined1 *local_f90;
  undefined1 *local_f88;
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  undefined4 uStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined4 local_f20;
  undefined4 uStack_f1c;
  undefined4 uStack_f18;
  undefined4 uStack_f14;
  undefined4 uStack_f10;
  undefined4 uStack_f0c;
  undefined4 uStack_f08;
  undefined4 uStack_f04;
  undefined1 *local_ef8;
  float *local_ef0;
  undefined1 *local_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0 [2];
  float afStack_e98 [2];
  float afStack_e90 [2];
  float afStack_e88 [2];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined1 *local_e58;
  float *local_e50;
  undefined1 *local_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00 [2];
  float afStack_df8 [2];
  float afStack_df0 [2];
  float afStack_de8 [2];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 *local_db8;
  float *local_db0;
  float *local_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60 [2];
  float afStack_d58 [2];
  float afStack_d50 [2];
  float afStack_d48 [2];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined4 local_d14;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined4 local_cf4;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined4 local_cd4;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined4 local_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined4 local_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined4 local_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 local_780;
  undefined8 uStack_778;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  float *local_738;
  undefined1 *local_730;
  undefined8 *local_728;
  float local_720 [2];
  float afStack_718 [2];
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  float *local_6d8;
  undefined1 *local_6d0;
  undefined8 *local_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  float *local_678;
  undefined1 *local_670;
  undefined8 *local_668;
  float local_660 [2];
  float afStack_658 [2];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  float *local_618;
  undefined1 *local_610;
  undefined8 *local_608;
  float local_600 [2];
  float afStack_5f8 [2];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  float *local_5b8;
  undefined1 *local_5b0;
  undefined8 *local_5a8;
  float local_5a0 [2];
  float afStack_598 [2];
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 *local_558;
  float *local_550;
  undefined1 *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520 [2];
  float afStack_518 [2];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 *local_4f8;
  float *local_4f0;
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [2];
  float afStack_4b8 [2];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  float local_480 [2];
  float afStack_478 [2];
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  float local_420 [2];
  float afStack_418 [2];
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  float local_360 [2];
  float afStack_358 [2];
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  float local_300 [2];
  float afStack_2f8 [2];
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  float local_240 [2];
  float afStack_238 [2];
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 *local_198;
  float *local_190;
  undefined1 *local_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  undefined8 local_170;
  undefined8 uStack_168;
  float local_160 [2];
  float afStack_158 [2];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 *local_138;
  float *local_130;
  undefined1 *local_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  undefined8 local_110;
  undefined8 uStack_108;
  float local_100 [2];
  float afStack_f8 [2];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined1 *local_d8;
  float *local_d0;
  float *local_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  float local_a0 [2];
  float afStack_98 [2];
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar74 [24];
  undefined1 auVar75 [32];
  
  local_29fc = *(int *)((long)in_RSI + 0x2c);
  local_2a00 = (int)in_RSI[6];
  local_2a04 = *(int *)((long)in_RSI + 0x34);
  local_2a08 = (int)in_RSI[7];
  local_2a0c = (int)in_RSI[3];
  local_2a10 = local_29fc * local_2a00 * local_2a04 * local_2a0c;
  local_29f0 = in_RSI;
  for (local_2a14 = 0; local_2a14 < local_2a08; local_2a14 = local_2a14 + 1) {
    local_29d0 = &local_2a68;
    local_1e84 = *(int *)((long)local_29f0 + 0x2c);
    local_1e88 = (int)local_29f0[6];
    local_1e8c = *(undefined4 *)((long)local_29f0 + 0x34);
    local_1e98 = (undefined1 (*) [32])
                 (*local_29f0 + local_29f0[8] * (long)local_2a14 * local_29f0[2]);
    local_1ea0 = local_29f0[2];
    local_1ea4 = (undefined4)local_29f0[3];
    local_1eb0 = local_29f0[4];
    local_1e80 = &local_2a68;
    local_1e70 = (long)local_1e84 * (long)local_1e88 * local_1ea0;
    local_29c8 = &local_2a68;
    local_29b8 = &local_2a68;
    local_1e74 = 0x10;
    local_29dc = local_2a14;
    local_29dd = 1;
    local_2a68 = 0;
    local_2a58 = 0;
    local_2a50 = 0;
    local_2a40 = 0;
    local_2a3c = 0;
    local_2a38 = 0;
    local_2a34 = 0;
    local_2a30 = 0;
    local_2a28 = 0;
    local_2a60 = 0;
    local_2a78 = 0;
    local_29a4 = 0x3f800000;
    local_1de4 = 0x3f800000;
    local_1de8 = 0x3f800000;
    local_1dec = 0x3f800000;
    local_1df0 = 0x3f800000;
    local_1df4 = 0x3f800000;
    local_1df8 = 0x3f800000;
    local_1dfc = 0x3f800000;
    local_1e00 = 0x3f800000;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    local_1e20 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auStack_1e10 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    local_2980._8_8_ = SUB328(ZEXT832(0),4);
    local_2a20 = local_1e98;
    for (; local_2a78 + 7 < local_2a10; local_2a78 = local_2a78 + 8) {
      local_2948 = local_2a20;
      local_2920 = *(undefined8 *)*local_2a20;
      uStack_2918 = *(undefined8 *)(*local_2a20 + 8);
      uStack_2910 = *(undefined8 *)(*local_2a20 + 0x10);
      uStack_2908 = *(undefined8 *)(*local_2a20 + 0x18);
      uStack_2ad4 = (undefined4)((ulong)uStack_2918 >> 0x20);
      uStack_2ad0 = (undefined4)uStack_2910;
      uStack_2acc = (undefined4)((ulong)uStack_2910 >> 0x20);
      uStack_2ac8 = (undefined4)uStack_2908;
      uStack_2ac4 = (undefined4)((ulong)uStack_2908 >> 0x20);
      auVar1._12_4_ = uStack_2ad4;
      auVar1._0_12_ = *(undefined1 (*) [12])*local_2a20;
      auVar1._16_4_ = uStack_2ad0;
      auVar1._20_4_ = uStack_2acc;
      auVar1._24_4_ = uStack_2ac8;
      auVar1._28_4_ = uStack_2ac4;
      local_29a0 = ZEXT1632(ZEXT816(0) << 0x40);
      auVar2 = vcmpps_avx(local_29a0,auVar1,1);
      local_2900[0] = 0x7fffffff;
      local_2900[1] = 0x7fffffff;
      aiStack_28f8[0] = 0x7fffffff;
      aiStack_28f8[1] = 0x7fffffff;
      aiStack_28f0[0] = 0x7fffffff;
      aiStack_28f0[1] = 0x7fffffff;
      aiStack_28e8[0] = 0x7fffffff;
      aiStack_28e8[1] = 0x7fffffff;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar6._0_4_ = 0x7fffffff;
      auVar6._4_4_ = 0x7fffffff;
      auVar6._16_4_ = 0x7fffffff;
      auVar6._20_4_ = 0x7fffffff;
      auVar6._24_4_ = 0x7fffffff;
      auVar6._28_4_ = 0x7fffffff;
      auVar1 = vandps_avx(*local_2a20,auVar6);
      local_2300 = 0;
      uStack_22f8 = local_2980._8_8_;
      uStack_22f0 = 0;
      uStack_22e8 = 0;
      local_2b20 = auVar1._0_8_;
      local_2320 = local_2b20;
      uStack_2b18 = auVar1._8_8_;
      uStack_2318 = uStack_2b18;
      uStack_2b10 = auVar1._16_8_;
      uStack_2310 = uStack_2b10;
      uStack_2b08 = auVar1._24_8_;
      uStack_2308 = uStack_2b08;
      auVar1 = vsubps_avx(ZEXT832((ulong)local_2980._8_8_) << 0x40,auVar1);
      local_2800 = 0x3f8000003f800000;
      uStack_27f8 = 0x3f8000003f800000;
      uStack_27f0 = 0x3f8000003f800000;
      uStack_27e8 = 0x3f8000003f800000;
      local_24a0._0_8_ = auVar1._0_8_;
      local_c40 = local_24a0._0_8_;
      local_24a0._8_8_ = auVar1._8_8_;
      uStack_c38 = local_24a0._8_8_;
      local_24a0._16_8_ = auVar1._16_8_;
      uStack_c30 = local_24a0._16_8_;
      local_24a0._24_8_ = auVar1._24_8_;
      uStack_c28 = local_24a0._24_8_;
      local_c60 = 0x42b0c0a542b0c0a5;
      uStack_c58 = 0x42b0c0a542b0c0a5;
      uStack_c50 = 0x42b0c0a542b0c0a5;
      uStack_c48 = 0x42b0c0a542b0c0a5;
      auVar46._8_8_ = 0x42b0c0a542b0c0a5;
      auVar46._0_8_ = 0x42b0c0a542b0c0a5;
      auVar46._16_8_ = 0x42b0c0a542b0c0a5;
      auVar46._24_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar46);
      local_24a0._0_8_ = auVar1._0_8_;
      local_1dc0 = local_24a0._0_8_;
      local_24a0._8_8_ = auVar1._8_8_;
      uStack_1db8 = local_24a0._8_8_;
      local_24a0._16_8_ = auVar1._16_8_;
      uStack_1db0 = local_24a0._16_8_;
      local_24a0._24_8_ = auVar1._24_8_;
      uStack_1da8 = local_24a0._24_8_;
      local_1de0 = 0xc2b0c0a5c2b0c0a5;
      uStack_1dd8 = 0xc2b0c0a5c2b0c0a5;
      uStack_1dd0 = 0xc2b0c0a5c2b0c0a5;
      uStack_1dc8 = 0xc2b0c0a5c2b0c0a5;
      auVar36._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar1,auVar36);
      local_1998 = local_24a0;
      local_15d0 = ::_ps256_cephes_LOG2EF;
      local_15d8 = ::_ps256_0p5;
      local_24a0._0_8_ = auVar6._0_8_;
      uVar9 = local_24a0._0_8_;
      local_24a0._8_8_ = auVar6._8_8_;
      uVar10 = local_24a0._8_8_;
      local_24a0._16_8_ = auVar6._16_8_;
      uVar11 = local_24a0._16_8_;
      local_24a0._24_8_ = auVar6._24_8_;
      uVar12 = local_24a0._24_8_;
      local_1580[0] = 1.442695;
      local_1580[1] = 1.442695;
      afStack_1578[0] = 1.442695;
      afStack_1578[1] = 1.442695;
      afStack_1570[0] = 1.442695;
      afStack_1570[1] = 1.442695;
      afStack_1568[0] = 1.442695;
      afStack_1568[1] = 1.442695;
      local_1560._0_4_ = auVar6._0_4_;
      local_1560._4_4_ = auVar6._4_4_;
      uStack_1558._0_4_ = auVar6._8_4_;
      uStack_1558._4_4_ = auVar6._12_4_;
      uStack_1550._0_4_ = auVar6._16_4_;
      uStack_1550._4_4_ = auVar6._20_4_;
      uStack_1548._0_4_ = auVar6._24_4_;
      uStack_1584 = 0x3fb8aa3b;
      local_15a0 = (float)local_1560 * 1.442695;
      fStack_159c = local_1560._4_4_ * 1.442695;
      fStack_1598 = (float)uStack_1558 * 1.442695;
      fStack_1594 = uStack_1558._4_4_ * 1.442695;
      fStack_1590 = (float)uStack_1550 * 1.442695;
      fStack_158c = uStack_1550._4_4_ * 1.442695;
      fStack_1588 = (float)uStack_1548 * 1.442695;
      local_15c0[0] = 0.5;
      local_15c0[1] = 0.5;
      afStack_15b8[0] = 0.5;
      afStack_15b8[1] = 0.5;
      afStack_15b0[0] = 0.5;
      afStack_15b0[1] = 0.5;
      afStack_15a8[0] = 0.5;
      afStack_15a8[1] = 0.5;
      local_24e0._4_4_ = fStack_159c + 0.5;
      local_24e0._0_4_ = local_15a0 + 0.5;
      uStack_24d8._0_4_ = fStack_1598 + 0.5;
      uStack_24d8._4_4_ = fStack_1594 + 0.5;
      uStack_24d0._0_4_ = fStack_1590 + 0.5;
      uStack_24d0._4_4_ = fStack_158c + 0.5;
      uStack_24c8._0_4_ = fStack_1588 + 0.5;
      uStack_24c8._4_4_ = 0x3ff8aa3b;
      auVar8 = vroundps_avx(_local_24e0,1);
      auVar1 = vcmpps_avx(_local_24e0,auVar8,1);
      local_2540._0_8_ = auVar1._0_8_;
      local_2440 = local_2540._0_8_;
      local_2540._8_8_ = auVar1._8_8_;
      uStack_2438 = local_2540._8_8_;
      local_2540._16_8_ = auVar1._16_8_;
      uStack_2430 = local_2540._16_8_;
      local_2540._24_8_ = auVar1._24_8_;
      uStack_2428 = local_2540._24_8_;
      local_2460 = 0x3f8000003f800000;
      uStack_2458 = 0x3f8000003f800000;
      uStack_2450 = 0x3f8000003f800000;
      uStack_2448 = 0x3f8000003f800000;
      auVar26._8_8_ = 0x3f8000003f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._16_8_ = 0x3f8000003f800000;
      auVar26._24_8_ = 0x3f8000003f800000;
      local_2540 = vandps_avx(auVar1,auVar26);
      local_24c0 = auVar8._0_8_;
      local_23c0 = local_24c0;
      uStack_24b8 = auVar8._8_8_;
      uStack_23b8 = uStack_24b8;
      uStack_24b0 = auVar8._16_8_;
      uStack_23b0 = uStack_24b0;
      uStack_24a8 = auVar8._24_8_;
      uStack_23a8 = uStack_24a8;
      local_23e0 = local_2540._0_8_;
      uStack_23d8 = local_2540._8_8_;
      uStack_23d0 = local_2540._16_8_;
      uStack_23c8 = local_2540._24_8_;
      _local_24e0 = vsubps_avx(auVar8,local_2540);
      local_ee8 = local_24e0;
      local_e50 = ::_ps256_cephes_exp_C1;
      local_e20 = local_24a0._0_8_;
      uStack_e18 = local_24a0._8_8_;
      uStack_e10 = local_24a0._16_8_;
      uStack_e08 = local_24a0._24_8_;
      local_e00[0] = 0.6933594;
      local_e00[1] = 0.6933594;
      afStack_df8[0] = 0.6933594;
      afStack_df8[1] = 0.6933594;
      afStack_df0[0] = 0.6933594;
      afStack_df0[1] = 0.6933594;
      afStack_de8[0] = 0.6933594;
      afStack_de8[1] = 0.6933594;
      local_de0._0_4_ = local_24e0._0_4_;
      local_de0._4_4_ = local_24e0._4_4_;
      uStack_dd8._0_4_ = local_24e0._8_4_;
      uStack_dd8._4_4_ = local_24e0._12_4_;
      uStack_dd0._0_4_ = local_24e0._16_4_;
      uStack_dd0._4_4_ = local_24e0._20_4_;
      uStack_dc8._0_4_ = local_24e0._24_4_;
      uStack_dc8._4_4_ = local_24e0._28_4_;
      fStack_e24 = uStack_dc8._4_4_;
      local_e40 = (float)local_de0 * 0.6933594;
      fStack_e3c = local_de0._4_4_ * 0.6933594;
      fStack_e38 = (float)uStack_dd8 * 0.6933594;
      fStack_e34 = uStack_dd8._4_4_ * 0.6933594;
      fStack_e30 = (float)uStack_dd0 * 0.6933594;
      fStack_e2c = uStack_dd0._4_4_ * 0.6933594;
      fStack_e28 = (float)uStack_dc8 * 0.6933594;
      auVar43._4_4_ = fStack_e3c;
      auVar43._0_4_ = local_e40;
      auVar43._8_4_ = fStack_e38;
      auVar43._12_4_ = fStack_e34;
      auVar43._16_4_ = fStack_e30;
      auVar43._20_4_ = fStack_e2c;
      auVar43._24_4_ = fStack_e28;
      auVar43._28_4_ = uStack_dc8._4_4_;
      auVar1 = vsubps_avx(auVar6,auVar43);
      local_ef0 = ::_ps256_cephes_exp_C2;
      local_24a0._0_8_ = auVar1._0_8_;
      local_ec0 = local_24a0._0_8_;
      local_24a0._8_8_ = auVar1._8_8_;
      uStack_eb8 = local_24a0._8_8_;
      local_24a0._16_8_ = auVar1._16_8_;
      uStack_eb0 = local_24a0._16_8_;
      local_24a0._24_8_ = auVar1._24_8_;
      uStack_ea8 = local_24a0._24_8_;
      local_e80 = local_24e0;
      uStack_e78 = uStack_24d8;
      uStack_e70 = uStack_24d0;
      uStack_e68 = uStack_24c8;
      local_ea0[0] = -0.00021219444;
      local_ea0[1] = -0.00021219444;
      afStack_e98[0] = -0.00021219444;
      afStack_e98[1] = -0.00021219444;
      afStack_e90[0] = -0.00021219444;
      afStack_e90[1] = -0.00021219444;
      afStack_e88[0] = -0.00021219444;
      afStack_e88[1] = -0.00021219444;
      fStack_ec4 = uStack_dc8._4_4_;
      local_ee0 = (float)local_de0 * -0.00021219444;
      fStack_edc = local_de0._4_4_ * -0.00021219444;
      fStack_ed8 = (float)uStack_dd8 * -0.00021219444;
      fStack_ed4 = uStack_dd8._4_4_ * -0.00021219444;
      fStack_ed0 = (float)uStack_dd0 * -0.00021219444;
      fStack_ecc = uStack_dd0._4_4_ * -0.00021219444;
      fStack_ec8 = (float)uStack_dc8 * -0.00021219444;
      auVar42._4_4_ = fStack_edc;
      auVar42._0_4_ = local_ee0;
      auVar42._8_4_ = fStack_ed8;
      auVar42._12_4_ = fStack_ed4;
      auVar42._16_4_ = fStack_ed0;
      auVar42._20_4_ = fStack_ecc;
      auVar42._24_4_ = fStack_ec8;
      auVar42._28_4_ = uStack_dc8._4_4_;
      local_24a0 = vsubps_avx(auVar1,auVar42);
      local_1aa0 = local_24a0._0_8_;
      uStack_1a98 = local_24a0._8_8_;
      uStack_1a90 = local_24a0._16_8_;
      uStack_1a88 = local_24a0._24_8_;
      local_1a80._0_4_ = local_24a0._0_4_;
      local_1a80._4_4_ = local_24a0._4_4_;
      uStack_1a78._0_4_ = local_24a0._8_4_;
      uStack_1a78._4_4_ = local_24a0._12_4_;
      uStack_1a70._0_4_ = local_24a0._16_4_;
      uStack_1a70._4_4_ = local_24a0._20_4_;
      uStack_1a68._0_4_ = local_24a0._24_4_;
      uStack_1a68._4_4_ = local_24a0._28_4_;
      local_24c0 = CONCAT44(local_1a80._4_4_ * local_1a80._4_4_,
                            (float)local_1a80 * (float)local_1a80);
      uStack_24b8._0_4_ = (float)uStack_1a78 * (float)uStack_1a78;
      uStack_24b8._4_4_ = uStack_1a78._4_4_ * uStack_1a78._4_4_;
      uStack_24b0._0_4_ = (float)uStack_1a70 * (float)uStack_1a70;
      uStack_24b0._4_4_ = uStack_1a70._4_4_ * uStack_1a70._4_4_;
      auVar74 = _local_24c0;
      uStack_24a8._0_4_ = (float)uStack_1a68 * (float)uStack_1a68;
      uStack_24a8._4_4_ = uStack_1a68._4_4_;
      auVar26 = _local_24c0;
      local_1988 = &local_2560;
      local_1678 = ::_ps256_cephes_exp_p1;
      local_1600 = 0x3950696739506967;
      uStack_15f8 = 0x3950696739506967;
      uStack_15f0 = 0x3950696739506967;
      uStack_15e8 = 0x3950696739506967;
      local_1620 = local_24a0._0_8_;
      uStack_1618 = local_24a0._8_8_;
      uStack_1610 = local_24a0._16_8_;
      uStack_1608 = local_24a0._24_8_;
      fStack_1624 = uStack_1a68._4_4_;
      local_1640 = (float)local_1a80 * 0.00019875691;
      fStack_163c = local_1a80._4_4_ * 0.00019875691;
      fStack_1638 = (float)uStack_1a78 * 0.00019875691;
      fStack_1634 = uStack_1a78._4_4_ * 0.00019875691;
      fStack_1630 = (float)uStack_1a70 * 0.00019875691;
      fStack_162c = uStack_1a70._4_4_ * 0.00019875691;
      fStack_1628 = (float)uStack_1a68 * 0.00019875691;
      local_1660[0] = 0.0013981999;
      local_1660[1] = 0.0013981999;
      afStack_1658[0] = 0.0013981999;
      afStack_1658[1] = 0.0013981999;
      afStack_1650[0] = 0.0013981999;
      afStack_1650[1] = 0.0013981999;
      afStack_1648[0] = 0.0013981999;
      afStack_1648[1] = 0.0013981999;
      local_2560 = CONCAT44(fStack_163c + 0.0013981999,local_1640 + 0.0013981999);
      uStack_2558 = CONCAT44(fStack_1634 + 0.0013981999,fStack_1638 + 0.0013981999);
      uStack_2550 = CONCAT44(fStack_162c + 0.0013981999,fStack_1630 + 0.0013981999);
      uStack_2548 = CONCAT44(uStack_1a68._4_4_ + 0.0013981999,fStack_1628 + 0.0013981999);
      local_1718 = ::_ps256_cephes_exp_p2;
      local_16a0 = local_2560;
      uStack_1698 = uStack_2558;
      uStack_1690 = uStack_2550;
      uStack_1688 = uStack_2548;
      local_16c0 = local_24a0._0_8_;
      uStack_16b8 = local_24a0._8_8_;
      uStack_16b0 = local_24a0._16_8_;
      uStack_16a8 = local_24a0._24_8_;
      fStack_16c4 = uStack_1a68._4_4_;
      local_16e0 = (local_1640 + 0.0013981999) * (float)local_1a80;
      fStack_16dc = (fStack_163c + 0.0013981999) * local_1a80._4_4_;
      fStack_16d8 = (fStack_1638 + 0.0013981999) * (float)uStack_1a78;
      fStack_16d4 = (fStack_1634 + 0.0013981999) * uStack_1a78._4_4_;
      fStack_16d0 = (fStack_1630 + 0.0013981999) * (float)uStack_1a70;
      fStack_16cc = (fStack_162c + 0.0013981999) * uStack_1a70._4_4_;
      fStack_16c8 = (fStack_1628 + 0.0013981999) * (float)uStack_1a68;
      local_1700[0] = 0.008333452;
      local_1700[1] = 0.008333452;
      afStack_16f8[0] = 0.008333452;
      afStack_16f8[1] = 0.008333452;
      afStack_16f0[0] = 0.008333452;
      afStack_16f0[1] = 0.008333452;
      afStack_16e8[0] = 0.008333452;
      afStack_16e8[1] = 0.008333452;
      local_2560 = CONCAT44(fStack_16dc + 0.008333452,local_16e0 + 0.008333452);
      uStack_2558 = CONCAT44(fStack_16d4 + 0.008333452,fStack_16d8 + 0.008333452);
      uStack_2550 = CONCAT44(fStack_16cc + 0.008333452,fStack_16d0 + 0.008333452);
      uStack_2548 = CONCAT44(uStack_1a68._4_4_ + 0.008333452,fStack_16c8 + 0.008333452);
      local_17b8 = ::_ps256_cephes_exp_p3;
      local_1740 = local_2560;
      uStack_1738 = uStack_2558;
      uStack_1730 = uStack_2550;
      uStack_1728 = uStack_2548;
      local_1760 = local_24a0._0_8_;
      uStack_1758 = local_24a0._8_8_;
      uStack_1750 = local_24a0._16_8_;
      uStack_1748 = local_24a0._24_8_;
      fStack_1764 = uStack_1a68._4_4_;
      local_1780 = (local_16e0 + 0.008333452) * (float)local_1a80;
      fStack_177c = (fStack_16dc + 0.008333452) * local_1a80._4_4_;
      fStack_1778 = (fStack_16d8 + 0.008333452) * (float)uStack_1a78;
      fStack_1774 = (fStack_16d4 + 0.008333452) * uStack_1a78._4_4_;
      fStack_1770 = (fStack_16d0 + 0.008333452) * (float)uStack_1a70;
      fStack_176c = (fStack_16cc + 0.008333452) * uStack_1a70._4_4_;
      fStack_1768 = (fStack_16c8 + 0.008333452) * (float)uStack_1a68;
      local_17a0[0] = 0.041665796;
      local_17a0[1] = 0.041665796;
      afStack_1798[0] = 0.041665796;
      afStack_1798[1] = 0.041665796;
      afStack_1790[0] = 0.041665796;
      afStack_1790[1] = 0.041665796;
      afStack_1788[0] = 0.041665796;
      afStack_1788[1] = 0.041665796;
      local_2560 = CONCAT44(fStack_177c + 0.041665796,local_1780 + 0.041665796);
      uStack_2558 = CONCAT44(fStack_1774 + 0.041665796,fStack_1778 + 0.041665796);
      uStack_2550 = CONCAT44(fStack_176c + 0.041665796,fStack_1770 + 0.041665796);
      uStack_2548 = CONCAT44(uStack_1a68._4_4_ + 0.041665796,fStack_1768 + 0.041665796);
      local_1858 = ::_ps256_cephes_exp_p4;
      local_17e0 = local_2560;
      uStack_17d8 = uStack_2558;
      uStack_17d0 = uStack_2550;
      uStack_17c8 = uStack_2548;
      local_1800 = local_24a0._0_8_;
      uStack_17f8 = local_24a0._8_8_;
      uStack_17f0 = local_24a0._16_8_;
      uStack_17e8 = local_24a0._24_8_;
      fStack_1804 = uStack_1a68._4_4_;
      local_1820 = (local_1780 + 0.041665796) * (float)local_1a80;
      fStack_181c = (fStack_177c + 0.041665796) * local_1a80._4_4_;
      fStack_1818 = (fStack_1778 + 0.041665796) * (float)uStack_1a78;
      fStack_1814 = (fStack_1774 + 0.041665796) * uStack_1a78._4_4_;
      fStack_1810 = (fStack_1770 + 0.041665796) * (float)uStack_1a70;
      fStack_180c = (fStack_176c + 0.041665796) * uStack_1a70._4_4_;
      fStack_1808 = (fStack_1768 + 0.041665796) * (float)uStack_1a68;
      local_1840[0] = 0.16666666;
      local_1840[1] = 0.16666666;
      afStack_1838[0] = 0.16666666;
      afStack_1838[1] = 0.16666666;
      afStack_1830[0] = 0.16666666;
      afStack_1830[1] = 0.16666666;
      afStack_1828[0] = 0.16666666;
      afStack_1828[1] = 0.16666666;
      local_2560 = CONCAT44(fStack_181c + 0.16666666,local_1820 + 0.16666666);
      uStack_2558 = CONCAT44(fStack_1814 + 0.16666666,fStack_1818 + 0.16666666);
      uStack_2550 = CONCAT44(fStack_180c + 0.16666666,fStack_1810 + 0.16666666);
      uStack_2548 = CONCAT44(uStack_1a68._4_4_ + 0.16666666,fStack_1808 + 0.16666666);
      local_18f8 = ::_ps256_cephes_exp_p5;
      local_1880 = local_2560;
      uStack_1878 = uStack_2558;
      uStack_1870 = uStack_2550;
      uStack_1868 = uStack_2548;
      local_18a0 = local_24a0._0_8_;
      uStack_1898 = local_24a0._8_8_;
      uStack_1890 = local_24a0._16_8_;
      uStack_1888 = local_24a0._24_8_;
      fStack_18a4 = uStack_1a68._4_4_;
      local_18c0 = (local_1820 + 0.16666666) * (float)local_1a80;
      fStack_18bc = (fStack_181c + 0.16666666) * local_1a80._4_4_;
      fStack_18b8 = (fStack_1818 + 0.16666666) * (float)uStack_1a78;
      fStack_18b4 = (fStack_1814 + 0.16666666) * uStack_1a78._4_4_;
      fStack_18b0 = (fStack_1810 + 0.16666666) * (float)uStack_1a70;
      fStack_18ac = (fStack_180c + 0.16666666) * uStack_1a70._4_4_;
      fStack_18a8 = (fStack_1808 + 0.16666666) * (float)uStack_1a68;
      local_18e0[0] = 0.5;
      local_18e0[1] = 0.5;
      afStack_18d8[0] = 0.5;
      afStack_18d8[1] = 0.5;
      afStack_18d0[0] = 0.5;
      afStack_18d0[1] = 0.5;
      afStack_18c8[0] = 0.5;
      afStack_18c8[1] = 0.5;
      local_2560 = CONCAT44(fStack_18bc + 0.5,local_18c0 + 0.5);
      uStack_2558 = CONCAT44(fStack_18b4 + 0.5,fStack_18b8 + 0.5);
      uStack_2550 = CONCAT44(fStack_18ac + 0.5,fStack_18b0 + 0.5);
      uStack_2548 = CONCAT44(uStack_1a68._4_4_ + 0.5,fStack_18a8 + 0.5);
      local_1990 = &local_24c0;
      local_1920 = local_2560;
      uStack_1918 = uStack_2558;
      uStack_1910 = uStack_2550;
      uStack_1908 = uStack_2548;
      local_1940 = local_24c0;
      uStack_1938 = uStack_24b8;
      uStack_24b0 = auVar74._16_8_;
      uStack_1930 = uStack_24b0;
      uStack_24a8 = auVar26._24_8_;
      uStack_1928 = uStack_24a8;
      fStack_1944 = uStack_1a68._4_4_;
      local_1960 = (local_18c0 + 0.5) * (float)local_1a80 * (float)local_1a80;
      fStack_195c = (fStack_18bc + 0.5) * local_1a80._4_4_ * local_1a80._4_4_;
      fStack_1958 = (fStack_18b8 + 0.5) * (float)uStack_1a78 * (float)uStack_1a78;
      fStack_1954 = (fStack_18b4 + 0.5) * uStack_1a78._4_4_ * uStack_1a78._4_4_;
      fStack_1950 = (fStack_18b0 + 0.5) * (float)uStack_1a70 * (float)uStack_1a70;
      fStack_194c = (fStack_18ac + 0.5) * uStack_1a70._4_4_ * uStack_1a70._4_4_;
      fStack_1948 = (fStack_18a8 + 0.5) * (float)uStack_1a68 * (float)uStack_1a68;
      local_1980 = local_24a0._0_8_;
      uStack_1978 = local_24a0._8_8_;
      uStack_1970 = local_24a0._16_8_;
      uStack_1968 = local_24a0._24_8_;
      local_2560 = CONCAT44(fStack_195c + local_1a80._4_4_,local_1960 + (float)local_1a80);
      uStack_2558 = CONCAT44(fStack_1954 + uStack_1a78._4_4_,fStack_1958 + (float)uStack_1a78);
      uStack_2550 = CONCAT44(fStack_194c + uStack_1a70._4_4_,fStack_1950 + (float)uStack_1a70);
      uStack_2548 = CONCAT44(uStack_1a68._4_4_ + uStack_1a68._4_4_,fStack_1948 + (float)uStack_1a68)
      ;
      local_2400 = local_2560;
      uStack_23f8 = uStack_2558;
      uStack_23f0 = uStack_2550;
      uStack_23e8 = uStack_2548;
      local_2420 = 0x3f8000003f800000;
      uStack_2418 = 0x3f8000003f800000;
      uStack_2410 = 0x3f8000003f800000;
      uStack_2408 = 0x3f8000003f800000;
      fVar65 = local_1960 + (float)local_1a80 + 1.0;
      fVar66 = fStack_195c + local_1a80._4_4_ + 1.0;
      fVar67 = fStack_1958 + (float)uStack_1a78 + 1.0;
      fVar68 = fStack_1954 + uStack_1a78._4_4_ + 1.0;
      fVar69 = fStack_1950 + (float)uStack_1a70 + 1.0;
      fVar70 = fStack_194c + uStack_1a70._4_4_ + 1.0;
      fVar71 = fStack_1948 + (float)uStack_1a68 + 1.0;
      fVar72 = uStack_1a68._4_4_ + uStack_1a68._4_4_ + 1.0;
      local_2560 = CONCAT44(fVar66,fVar65);
      uStack_2558 = CONCAT44(fVar68,fVar67);
      uStack_2550 = CONCAT44(fVar70,fVar69);
      uStack_2548 = CONCAT44(fVar72,fVar71);
      local_c20 = local_24e0;
      uStack_c18 = uStack_24d8;
      uStack_c10 = uStack_24d0;
      uStack_c08 = uStack_24c8;
      local_2500 = CONCAT44((int)local_de0._4_4_,(int)(float)local_de0);
      uStack_24f8 = CONCAT44((int)uStack_dd8._4_4_,(int)(float)uStack_dd8);
      uStack_24f0 = CONCAT44((int)uStack_dd0._4_4_,(int)(float)uStack_dd0);
      uStack_24e8 = CONCAT44((int)uStack_dc8._4_4_,(int)(float)uStack_dc8);
      local_b20 = local_2500;
      uStack_b18 = uStack_24f8;
      uStack_b10 = uStack_24f0;
      uStack_b08 = uStack_24e8;
      local_1b40 = 0x7f0000007f;
      uStack_1b38 = 0x7f0000007f;
      uStack_1b30 = 0x7f0000007f;
      uStack_1b28 = 0x7f0000007f;
      local_bc0 = local_2500;
      uStack_bb8 = uStack_24f8;
      uStack_bb0 = uStack_24f0;
      uStack_ba8 = uStack_24e8;
      local_be0 = 0x7f0000007f;
      uStack_bd8 = 0x7f0000007f;
      uStack_bd0 = 0x7f0000007f;
      uStack_bc8 = 0x7f0000007f;
      local_b70 = 0x7f0000007f;
      uStack_b68 = 0x7f0000007f;
      local_b80 = 0x7f0000007f;
      uStack_b78 = 0x7f0000007f;
      local_9e0 = local_2500;
      uStack_9d8 = uStack_24f8;
      local_9f0 = 0x7f0000007f;
      uStack_9e8 = 0x7f0000007f;
      auVar48._8_8_ = uStack_24f8;
      auVar48._0_8_ = local_2500;
      auVar47._8_8_ = 0x7f0000007f;
      auVar47._0_8_ = 0x7f0000007f;
      local_b50 = vpaddd_avx(auVar48,auVar47);
      local_a00 = uStack_24f0;
      uStack_9f8 = uStack_24e8;
      local_a10 = 0x7f0000007f;
      uStack_a08 = 0x7f0000007f;
      auVar5._8_8_ = uStack_24e8;
      auVar5._0_8_ = uStack_24f0;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_b60 = vpaddd_avx(auVar5,auVar3);
      local_c00 = local_b50._0_8_;
      uStack_bf8 = local_b50._8_8_;
      uStack_bf0 = local_b60._0_8_;
      uStack_be8 = local_b60._8_8_;
      local_ba0 = local_b50._0_8_;
      uStack_b98 = local_b50._8_8_;
      uStack_b90 = local_b60._0_8_;
      uStack_b88 = local_b60._8_8_;
      local_a60 = local_b50._0_8_;
      uStack_a58 = local_b50._8_8_;
      uStack_a50 = local_b60._0_8_;
      uStack_a48 = local_b60._8_8_;
      local_a64 = 0x17;
      local_ae0 = local_b50._0_8_;
      uStack_ad8 = local_b50._8_8_;
      uStack_ad0 = local_b60._0_8_;
      uStack_ac8 = local_b60._8_8_;
      local_980 = local_b50._0_8_;
      uStack_978 = local_b50._8_8_;
      local_984 = 0x17;
      local_a80 = vpslld_avx(local_b50,ZEXT416(0x17));
      local_9a0 = local_b60._0_8_;
      uStack_998 = local_b60._8_8_;
      local_9a4 = 0x17;
      local_a90 = vpslld_avx(local_b60,ZEXT416(0x17));
      local_b00 = local_a80._0_8_;
      uStack_af8 = local_a80._8_8_;
      uStack_af0 = local_a90._0_8_;
      uStack_ae8 = local_a90._8_8_;
      local_ac0 = local_a80._0_8_;
      uStack_ab8 = local_a80._8_8_;
      uStack_ab0 = local_a90._0_8_;
      uStack_aa8 = local_a90._8_8_;
      local_2500 = local_a80._0_8_;
      uStack_24f8 = local_a80._8_8_;
      uStack_24f0 = local_a90._0_8_;
      uStack_24e8 = local_a90._8_8_;
      local_a40 = local_a80._0_8_;
      uStack_a38 = local_a80._8_8_;
      uStack_a30 = local_a90._0_8_;
      uStack_a28 = local_a90._8_8_;
      local_2580 = local_a80._0_8_;
      uStack_2578 = local_a80._8_8_;
      uStack_2570 = local_a90._0_8_;
      uStack_2568 = local_a90._8_8_;
      local_1ac0 = local_2560;
      uStack_1ab8 = uStack_2558;
      uStack_1ab0 = uStack_2550;
      uStack_1aa8 = uStack_2548;
      local_1ae0 = local_a80._0_8_;
      uStack_1ad8 = local_a80._8_8_;
      uStack_1ad0 = local_a90._0_8_;
      uStack_1ac8 = local_a90._8_8_;
      fVar65 = fVar65 * local_a80._0_4_;
      fVar66 = fVar66 * local_a80._4_4_;
      fVar67 = fVar67 * local_a80._8_4_;
      fVar68 = fVar68 * local_a80._12_4_;
      fVar69 = fVar69 * local_a90._0_4_;
      fVar70 = fVar70 * local_a90._4_4_;
      fVar71 = fVar71 * local_a90._8_4_;
      local_2560 = CONCAT44(fVar66,fVar65);
      uStack_2558 = CONCAT44(fVar68,fVar67);
      uStack_2550 = CONCAT44(fVar70,fVar69);
      uStack_2548 = CONCAT44(fVar72,fVar71);
      local_25c0 = local_2560;
      uStack_25b8 = uStack_2558;
      uStack_25b0 = uStack_2550;
      uStack_25a8 = uStack_2548;
      local_25a0._0_4_ = local_1e20._0_4_;
      local_25a0._4_4_ = local_1e20._4_4_;
      uStack_2598._0_4_ = local_1e20._8_4_;
      uStack_2598._4_4_ = local_1e20._12_4_;
      uStack_2590._0_4_ = auStack_1e10._0_4_;
      uStack_2590._4_4_ = auStack_1e10._4_4_;
      uStack_2588._0_4_ = auStack_1e10._8_4_;
      uStack_2588._4_4_ = auStack_1e10._12_4_;
      auVar73._0_8_ = CONCAT44(local_25a0._4_4_ + fVar66,(float)local_25a0 + fVar65);
      auVar73._8_4_ = (float)uStack_2598 + fVar67;
      auVar73._12_4_ = uStack_2598._4_4_ + fVar68;
      auVar74._16_4_ = (float)uStack_2590 + fVar69;
      auVar74._0_16_ = auVar73;
      auVar74._20_4_ = uStack_2590._4_4_ + fVar70;
      auVar75._24_4_ = (float)uStack_2588 + fVar71;
      auVar75._0_24_ = auVar74;
      auVar75._28_4_ = uStack_2588._4_4_ + fVar72;
      local_27a0 = ZEXT1632(ZEXT816(0) << 0x40);
      local_2820 = vcmpps_avx(auVar75,local_27a0,2);
      uStack_27b8 = auVar73._8_8_;
      uStack_1d78 = uStack_27b8;
      uStack_27b0 = auVar74._16_8_;
      uStack_1d70 = uStack_27b0;
      uStack_27a8 = auVar75._24_8_;
      uStack_1d68 = uStack_27a8;
      local_1da0 = 0x80000000800000;
      uStack_1d98 = 0x80000000800000;
      uStack_1d90 = 0x80000000800000;
      uStack_1d88 = 0x80000000800000;
      auVar38._16_8_ = uStack_27b0;
      auVar38._0_16_ = auVar73;
      auVar38._24_8_ = uStack_27a8;
      auVar37._8_8_ = 0x80000000800000;
      auVar37._0_8_ = 0x80000000800000;
      auVar37._16_8_ = 0x80000000800000;
      auVar37._24_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(auVar38,auVar37);
      local_27c0 = auVar1._0_8_;
      local_1ca0 = local_27c0;
      uStack_27b8 = auVar1._8_8_;
      uStack_1c98 = uStack_27b8;
      uStack_27b0 = auVar1._16_8_;
      uStack_1c90 = uStack_27b0;
      uStack_27a8 = auVar1._24_8_;
      uStack_1c88 = uStack_27a8;
      local_1cc0 = local_27c0;
      uStack_1cb8 = uStack_27b8;
      uStack_1cb0 = uStack_27b0;
      uStack_1ca8 = uStack_27a8;
      local_1cc4 = 0x17;
      local_1d40 = local_27c0;
      uStack_1d38 = uStack_27b8;
      uStack_1d30 = uStack_27b0;
      uStack_1d28 = uStack_27a8;
      local_cf0 = local_27c0;
      uStack_ce8 = uStack_27b8;
      local_cf4 = 0x17;
      local_1ce0 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
      local_d10 = uStack_27b0;
      uStack_d08 = uStack_27a8;
      local_d14 = 0x17;
      local_1cf0 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
      local_1d60 = local_1ce0._0_8_;
      uStack_1d58 = local_1ce0._8_8_;
      uStack_1d50 = local_1cf0._0_8_;
      uStack_1d48 = local_1cf0._8_8_;
      local_1d20 = local_1ce0._0_8_;
      uStack_1d18 = local_1ce0._8_8_;
      uStack_1d10 = local_1cf0._0_8_;
      uStack_1d08 = local_1cf0._8_8_;
      local_26e0 = local_27c0;
      uStack_26d8 = uStack_27b8;
      uStack_26d0 = uStack_27b0;
      uStack_26c8 = uStack_27a8;
      local_2700 = 0x807fffff807fffff;
      uStack_26f8 = 0x807fffff807fffff;
      uStack_26f0 = 0x807fffff807fffff;
      uStack_26e8 = 0x807fffff807fffff;
      auVar25._8_8_ = 0x807fffff807fffff;
      auVar25._0_8_ = 0x807fffff807fffff;
      auVar25._16_8_ = 0x807fffff807fffff;
      auVar25._24_8_ = 0x807fffff807fffff;
      auVar1 = vandps_avx(auVar1,auVar25);
      local_27c0 = auVar1._0_8_;
      local_1c20 = local_27c0;
      uStack_27b8 = auVar1._8_8_;
      uStack_1c18 = uStack_27b8;
      uStack_27b0 = auVar1._16_8_;
      uStack_1c10 = uStack_27b0;
      uStack_27a8 = auVar1._24_8_;
      uStack_1c08 = uStack_27a8;
      local_1c40 = 0x3f0000003f000000;
      uStack_1c38 = 0x3f0000003f000000;
      uStack_1c30 = 0x3f0000003f000000;
      uStack_1c28 = 0x3f0000003f000000;
      auVar40._8_8_ = 0x3f0000003f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._16_8_ = 0x3f0000003f000000;
      auVar40._24_8_ = 0x3f0000003f000000;
      auVar6 = vorps_avx(auVar1,auVar40);
      local_1b20 = local_1ce0._0_8_;
      uStack_1b18 = local_1ce0._8_8_;
      uStack_1b10 = local_1cf0._0_8_;
      uStack_1b08 = local_1cf0._8_8_;
      local_1bc0 = local_1ce0._0_8_;
      uStack_1bb8 = local_1ce0._8_8_;
      uStack_1bb0 = local_1cf0._0_8_;
      uStack_1ba8 = local_1cf0._8_8_;
      local_1be0 = 0x7f0000007f;
      uStack_1bd8 = 0x7f0000007f;
      uStack_1bd0 = 0x7f0000007f;
      uStack_1bc8 = 0x7f0000007f;
      local_1b70 = 0x7f0000007f;
      uStack_1b68 = 0x7f0000007f;
      local_1b80 = 0x7f0000007f;
      uStack_1b78 = 0x7f0000007f;
      local_c90 = local_1ce0._0_8_;
      uStack_c88 = local_1ce0._8_8_;
      local_ca0 = 0x7f0000007f;
      uStack_c98 = 0x7f0000007f;
      auVar7._8_8_ = 0x7f0000007f;
      auVar7._0_8_ = 0x7f0000007f;
      local_1b50 = vpsubd_avx(local_1ce0,auVar7);
      local_cb0 = local_1cf0._0_8_;
      uStack_ca8 = local_1cf0._8_8_;
      local_cc0 = 0x7f0000007f;
      uStack_cb8 = 0x7f0000007f;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_1b60 = vpsubd_avx(local_1cf0,auVar4);
      local_1c00 = local_1b50._0_8_;
      uStack_1bf8 = local_1b50._8_8_;
      uStack_1bf0 = local_1b60._0_8_;
      uStack_1be8 = local_1b60._8_8_;
      local_1ba0 = local_1b50._0_8_;
      uStack_1b98 = local_1b50._8_8_;
      uStack_1b90 = local_1b60._0_8_;
      uStack_1b88 = local_1b60._8_8_;
      local_27e0 = local_1b50._0_8_;
      uStack_27d8 = local_1b50._8_8_;
      uStack_27d0 = local_1b60._0_8_;
      uStack_27c8 = local_1b60._8_8_;
      local_1b00 = local_1b50._0_8_;
      uStack_1af8 = local_1b50._8_8_;
      uStack_1af0 = local_1b60._0_8_;
      uStack_1ae8 = local_1b60._8_8_;
      auVar41._16_8_ = local_1b60._0_8_;
      auVar41._0_16_ = local_1b50;
      auVar41._24_8_ = local_1b60._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar41);
      local_2840 = auVar1._0_8_;
      uVar13 = local_2840;
      uStack_2838 = auVar1._8_8_;
      uVar14 = uStack_2838;
      uStack_2830 = auVar1._16_8_;
      uVar15 = uStack_2830;
      uStack_2828 = auVar1._24_8_;
      uVar16 = uStack_2828;
      local_2640 = 0x3f8000003f800000;
      uStack_2638 = 0x3f8000003f800000;
      uStack_2630 = 0x3f8000003f800000;
      uStack_2628 = 0x3f8000003f800000;
      local_2620._0_4_ = auVar1._0_4_;
      local_2620._4_4_ = auVar1._4_4_;
      uStack_2618._0_4_ = auVar1._8_4_;
      uStack_2618._4_4_ = auVar1._12_4_;
      uStack_2610._0_4_ = auVar1._16_4_;
      uStack_2610._4_4_ = auVar1._20_4_;
      uStack_2608._0_4_ = auVar1._24_4_;
      uStack_2608._4_4_ = auVar1._28_4_;
      local_2840._4_4_ = local_2620._4_4_ + 1.0;
      local_2840._0_4_ = (float)local_2620 + 1.0;
      uStack_2838._0_4_ = (float)uStack_2618 + 1.0;
      uStack_2838._4_4_ = uStack_2618._4_4_ + 1.0;
      uStack_2830._0_4_ = (float)uStack_2610 + 1.0;
      uStack_2830._4_4_ = uStack_2610._4_4_ + 1.0;
      auVar74 = _local_2840;
      uStack_2828._0_4_ = (float)uStack_2608 + 1.0;
      uStack_2828._4_4_ = uStack_2608._4_4_ + 1.0;
      auVar8 = _local_2840;
      local_2860 = vcmpps_avx(auVar6,_DAT_01f92720,1);
      local_27c0 = auVar6._0_8_;
      local_2720 = local_27c0;
      uStack_27b8 = auVar6._8_8_;
      uStack_2718 = uStack_27b8;
      uStack_27b0 = auVar6._16_8_;
      uStack_2710 = uStack_27b0;
      uStack_27a8 = auVar6._24_8_;
      uStack_2708 = uStack_27a8;
      local_2740 = local_2860._0_8_;
      uStack_2738 = local_2860._8_8_;
      uStack_2730 = local_2860._16_8_;
      uStack_2728 = local_2860._24_8_;
      local_2880 = vandps_avx(auVar6,local_2860);
      local_2340 = local_27c0;
      uStack_2338 = uStack_27b8;
      uStack_2330 = uStack_27b0;
      uStack_2328 = uStack_27a8;
      local_2360 = 0x3f8000003f800000;
      uStack_2358 = 0x3f8000003f800000;
      uStack_2350 = 0x3f8000003f800000;
      uStack_2348 = 0x3f8000003f800000;
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._16_8_ = 0x3f8000003f800000;
      auVar28._24_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar6,auVar28);
      local_2380 = local_2840;
      uStack_2378 = uStack_2838;
      uStack_2830 = auVar74._16_8_;
      uStack_2370 = uStack_2830;
      uStack_2828 = auVar8._24_8_;
      uStack_2368 = uStack_2828;
      local_2760 = 0x3f8000003f800000;
      uStack_2758 = 0x3f8000003f800000;
      uStack_2750 = 0x3f8000003f800000;
      uStack_2748 = 0x3f8000003f800000;
      local_2780 = local_2860._0_8_;
      uStack_2778 = local_2860._8_8_;
      uStack_2770 = local_2860._16_8_;
      uStack_2768 = local_2860._24_8_;
      auVar8._8_8_ = 0x3f8000003f800000;
      auVar8._0_8_ = 0x3f8000003f800000;
      auVar8._16_8_ = 0x3f8000003f800000;
      auVar8._24_8_ = 0x3f8000003f800000;
      local_23a0 = vandps_avx(auVar8,local_2860);
      auVar27._16_8_ = uStack_2830;
      auVar27._0_16_ = _local_2840;
      auVar27._24_8_ = uStack_2828;
      _local_2840 = vsubps_avx(auVar27,local_23a0);
      local_27c0 = auVar1._0_8_;
      uVar17 = local_27c0;
      uStack_27b8 = auVar1._8_8_;
      uVar18 = uStack_27b8;
      uStack_27b0 = auVar1._16_8_;
      uVar19 = uStack_27b0;
      uStack_27a8 = auVar1._24_8_;
      uVar20 = uStack_27a8;
      local_2660._0_4_ = auVar1._0_4_;
      local_2660._4_4_ = auVar1._4_4_;
      uStack_2658._0_4_ = auVar1._8_4_;
      uStack_2658._4_4_ = auVar1._12_4_;
      uStack_2650._0_4_ = auVar1._16_4_;
      uStack_2650._4_4_ = auVar1._20_4_;
      uStack_2648._0_4_ = auVar1._24_4_;
      uStack_2648._4_4_ = auVar1._28_4_;
      local_2680._0_4_ = local_2880._0_4_;
      local_2680._4_4_ = local_2880._4_4_;
      uStack_2678._0_4_ = local_2880._8_4_;
      uStack_2678._4_4_ = local_2880._12_4_;
      uStack_2670._0_4_ = local_2880._16_4_;
      uStack_2670._4_4_ = local_2880._20_4_;
      uStack_2668._0_4_ = local_2880._24_4_;
      uStack_2668._4_4_ = local_2880._28_4_;
      local_2660._0_4_ = (float)local_2660 + (float)local_2680;
      local_2660._4_4_ = local_2660._4_4_ + local_2680._4_4_;
      uStack_2658._0_4_ = (float)uStack_2658 + (float)uStack_2678;
      uStack_2658._4_4_ = uStack_2658._4_4_ + uStack_2678._4_4_;
      uStack_2650._0_4_ = (float)uStack_2650 + (float)uStack_2670;
      uStack_2650._4_4_ = uStack_2650._4_4_ + uStack_2670._4_4_;
      uStack_2648._0_4_ = (float)uStack_2648 + (float)uStack_2668;
      fStack_2884 = uStack_2648._4_4_ + uStack_2668._4_4_;
      local_27c0._4_4_ = local_2660._4_4_;
      local_27c0._0_4_ = (float)local_2660;
      uStack_27b8._0_4_ = (float)uStack_2658;
      uStack_27b8._4_4_ = uStack_2658._4_4_;
      uStack_27b0._0_4_ = (float)uStack_2650;
      uStack_27b0._4_4_ = uStack_2650._4_4_;
      auVar74 = _local_27c0;
      uStack_27a8._0_4_ = (float)uStack_2648;
      uStack_27a8._4_4_ = fStack_2884;
      auVar1 = _local_27c0;
      local_19e0 = local_27c0;
      uStack_19d8 = uStack_27b8;
      uStack_27b0 = auVar74._16_8_;
      uStack_19d0 = uStack_27b0;
      uStack_27a8 = auVar1._24_8_;
      uStack_19c8 = uStack_27a8;
      local_28a0 = (float)local_2660 * (float)local_2660;
      fStack_289c = local_2660._4_4_ * local_2660._4_4_;
      fStack_2898 = (float)uStack_2658 * (float)uStack_2658;
      fStack_2894 = uStack_2658._4_4_ * uStack_2658._4_4_;
      fStack_2890 = (float)uStack_2650 * (float)uStack_2650;
      fStack_288c = uStack_2650._4_4_ * uStack_2650._4_4_;
      fStack_2888 = (float)uStack_2648 * (float)uStack_2648;
      local_f88 = local_28c0;
      local_f90 = local_27c0;
      local_f98 = ::_ps256_cephes_log_p1;
      local_f20 = 0x3d9021bb;
      uStack_f1c = 0x3d9021bb;
      uStack_f18 = 0x3d9021bb;
      uStack_f14 = 0x3d9021bb;
      uStack_f10 = 0x3d9021bb;
      uStack_f0c = 0x3d9021bb;
      uStack_f08 = 0x3d9021bb;
      uStack_f44 = 0x3d9021bb;
      local_f40 = local_27c0;
      uStack_f38 = uStack_27b8;
      uStack_f30 = uStack_27b0;
      uStack_f28 = uStack_27a8;
      local_f60 = (float)local_2660 * 0.070376836;
      fStack_f5c = local_2660._4_4_ * 0.070376836;
      fStack_f58 = (float)uStack_2658 * 0.070376836;
      fStack_f54 = uStack_2658._4_4_ * 0.070376836;
      fStack_f50 = (float)uStack_2650 * 0.070376836;
      fStack_f4c = uStack_2650._4_4_ * 0.070376836;
      fStack_f48 = (float)uStack_2648 * 0.070376836;
      local_f80[0] = -0.1151461;
      local_f80[1] = -0.1151461;
      afStack_f78[0] = -0.1151461;
      afStack_f78[1] = -0.1151461;
      afStack_f70[0] = -0.1151461;
      afStack_f70[1] = -0.1151461;
      afStack_f68[0] = -0.1151461;
      afStack_f68[1] = -0.1151461;
      local_fc0 = local_f60 + -0.1151461;
      fStack_fbc = fStack_f5c + -0.1151461;
      fStack_fb8 = fStack_f58 + -0.1151461;
      fStack_fb4 = fStack_f54 + -0.1151461;
      fStack_fb0 = fStack_f50 + -0.1151461;
      fStack_fac = fStack_f4c + -0.1151461;
      fStack_fa8 = fStack_f48 + -0.1151461;
      uStack_fe4 = 0xbd375ffa;
      local_1028 = local_28c0;
      local_1030 = local_27c0;
      local_1038 = ::_ps256_cephes_log_p2;
      local_fe0 = local_27c0;
      uStack_fd8 = uStack_27b8;
      uStack_fd0 = uStack_27b0;
      uStack_fc8 = uStack_27a8;
      local_1000 = local_fc0 * (float)local_2660;
      fStack_ffc = fStack_fbc * local_2660._4_4_;
      fStack_ff8 = fStack_fb8 * (float)uStack_2658;
      fStack_ff4 = fStack_fb4 * uStack_2658._4_4_;
      fStack_ff0 = fStack_fb0 * (float)uStack_2650;
      fStack_fec = fStack_fac * uStack_2650._4_4_;
      fStack_fe8 = fStack_fa8 * (float)uStack_2648;
      local_1020[0] = 0.116769984;
      local_1020[1] = 0.116769984;
      afStack_1018[0] = 0.116769984;
      afStack_1018[1] = 0.116769984;
      afStack_1010[0] = 0.116769984;
      afStack_1010[1] = 0.116769984;
      afStack_1008[0] = 0.116769984;
      afStack_1008[1] = 0.116769984;
      local_1060 = local_1000 + 0.116769984;
      fStack_105c = fStack_ffc + 0.116769984;
      fStack_1058 = fStack_ff8 + 0.116769984;
      fStack_1054 = fStack_ff4 + 0.116769984;
      fStack_1050 = fStack_ff0 + 0.116769984;
      fStack_104c = fStack_fec + 0.116769984;
      fStack_1048 = fStack_fe8 + 0.116769984;
      uStack_1084 = 0x3d93751d;
      local_10c8 = local_28c0;
      local_10d0 = local_27c0;
      local_10d8 = ::_ps256_cephes_log_p3;
      local_1080 = local_27c0;
      uStack_1078 = uStack_27b8;
      uStack_1070 = uStack_27b0;
      uStack_1068 = uStack_27a8;
      local_10a0 = local_1060 * (float)local_2660;
      fStack_109c = fStack_105c * local_2660._4_4_;
      fStack_1098 = fStack_1058 * (float)uStack_2658;
      fStack_1094 = fStack_1054 * uStack_2658._4_4_;
      fStack_1090 = fStack_1050 * (float)uStack_2650;
      fStack_108c = fStack_104c * uStack_2650._4_4_;
      fStack_1088 = fStack_1048 * (float)uStack_2648;
      local_10c0[0] = -0.12420141;
      local_10c0[1] = -0.12420141;
      afStack_10b8[0] = -0.12420141;
      afStack_10b8[1] = -0.12420141;
      afStack_10b0[0] = -0.12420141;
      afStack_10b0[1] = -0.12420141;
      afStack_10a8[0] = -0.12420141;
      afStack_10a8[1] = -0.12420141;
      local_1100 = local_10a0 + -0.12420141;
      fStack_10fc = fStack_109c + -0.12420141;
      fStack_10f8 = fStack_1098 + -0.12420141;
      fStack_10f4 = fStack_1094 + -0.12420141;
      fStack_10f0 = fStack_1090 + -0.12420141;
      fStack_10ec = fStack_108c + -0.12420141;
      fStack_10e8 = fStack_1088 + -0.12420141;
      uStack_1124 = 0xbd55d064;
      local_1168 = local_28c0;
      local_1170 = local_27c0;
      local_1178 = ::_ps256_cephes_log_p4;
      local_1120 = local_27c0;
      uStack_1118 = uStack_27b8;
      uStack_1110 = uStack_27b0;
      uStack_1108 = uStack_27a8;
      local_1140 = local_1100 * (float)local_2660;
      fStack_113c = fStack_10fc * local_2660._4_4_;
      fStack_1138 = fStack_10f8 * (float)uStack_2658;
      fStack_1134 = fStack_10f4 * uStack_2658._4_4_;
      fStack_1130 = fStack_10f0 * (float)uStack_2650;
      fStack_112c = fStack_10ec * uStack_2650._4_4_;
      fStack_1128 = fStack_10e8 * (float)uStack_2648;
      local_1160[0] = 0.14249323;
      local_1160[1] = 0.14249323;
      afStack_1158[0] = 0.14249323;
      afStack_1158[1] = 0.14249323;
      afStack_1150[0] = 0.14249323;
      afStack_1150[1] = 0.14249323;
      afStack_1148[0] = 0.14249323;
      afStack_1148[1] = 0.14249323;
      local_11a0 = local_1140 + 0.14249323;
      fStack_119c = fStack_113c + 0.14249323;
      fStack_1198 = fStack_1138 + 0.14249323;
      fStack_1194 = fStack_1134 + 0.14249323;
      fStack_1190 = fStack_1130 + 0.14249323;
      fStack_118c = fStack_112c + 0.14249323;
      fStack_1188 = fStack_1128 + 0.14249323;
      uStack_11c4 = 0x3db8eb4c;
      local_1208 = local_28c0;
      local_1210 = local_27c0;
      local_1218 = ::_ps256_cephes_log_p5;
      local_11c0 = local_27c0;
      uStack_11b8 = uStack_27b8;
      uStack_11b0 = uStack_27b0;
      uStack_11a8 = uStack_27a8;
      local_11e0 = local_11a0 * (float)local_2660;
      fStack_11dc = fStack_119c * local_2660._4_4_;
      fStack_11d8 = fStack_1198 * (float)uStack_2658;
      fStack_11d4 = fStack_1194 * uStack_2658._4_4_;
      fStack_11d0 = fStack_1190 * (float)uStack_2650;
      fStack_11cc = fStack_118c * uStack_2650._4_4_;
      fStack_11c8 = fStack_1188 * (float)uStack_2648;
      local_1200[0] = -0.16668057;
      local_1200[1] = -0.16668057;
      afStack_11f8[0] = -0.16668057;
      afStack_11f8[1] = -0.16668057;
      afStack_11f0[0] = -0.16668057;
      afStack_11f0[1] = -0.16668057;
      afStack_11e8[0] = -0.16668057;
      afStack_11e8[1] = -0.16668057;
      local_1240 = local_11e0 + -0.16668057;
      fStack_123c = fStack_11dc + -0.16668057;
      fStack_1238 = fStack_11d8 + -0.16668057;
      fStack_1234 = fStack_11d4 + -0.16668057;
      fStack_1230 = fStack_11d0 + -0.16668057;
      fStack_122c = fStack_11cc + -0.16668057;
      fStack_1228 = fStack_11c8 + -0.16668057;
      uStack_1264 = 0xbd9c7154;
      local_12a8 = local_28c0;
      local_12b0 = local_27c0;
      local_12b8 = ::_ps256_cephes_log_p6;
      local_1260 = local_27c0;
      uStack_1258 = uStack_27b8;
      uStack_1250 = uStack_27b0;
      uStack_1248 = uStack_27a8;
      local_1280 = local_1240 * (float)local_2660;
      fStack_127c = fStack_123c * local_2660._4_4_;
      fStack_1278 = fStack_1238 * (float)uStack_2658;
      fStack_1274 = fStack_1234 * uStack_2658._4_4_;
      fStack_1270 = fStack_1230 * (float)uStack_2650;
      fStack_126c = fStack_122c * uStack_2650._4_4_;
      fStack_1268 = fStack_1228 * (float)uStack_2648;
      local_12a0[0] = 0.20000714;
      local_12a0[1] = 0.20000714;
      afStack_1298[0] = 0.20000714;
      afStack_1298[1] = 0.20000714;
      afStack_1290[0] = 0.20000714;
      afStack_1290[1] = 0.20000714;
      afStack_1288[0] = 0.20000714;
      afStack_1288[1] = 0.20000714;
      local_12e0 = local_1280 + 0.20000714;
      fStack_12dc = fStack_127c + 0.20000714;
      fStack_12d8 = fStack_1278 + 0.20000714;
      fStack_12d4 = fStack_1274 + 0.20000714;
      fStack_12d0 = fStack_1270 + 0.20000714;
      fStack_12cc = fStack_126c + 0.20000714;
      fStack_12c8 = fStack_1268 + 0.20000714;
      uStack_1304 = 0x3dfd2c04;
      local_1348 = local_28c0;
      local_1350 = local_27c0;
      local_1358 = ::_ps256_cephes_log_p7;
      local_1300 = local_27c0;
      uStack_12f8 = uStack_27b8;
      uStack_12f0 = uStack_27b0;
      uStack_12e8 = uStack_27a8;
      local_1320 = local_12e0 * (float)local_2660;
      fStack_131c = fStack_12dc * local_2660._4_4_;
      fStack_1318 = fStack_12d8 * (float)uStack_2658;
      fStack_1314 = fStack_12d4 * uStack_2658._4_4_;
      fStack_1310 = fStack_12d0 * (float)uStack_2650;
      fStack_130c = fStack_12cc * uStack_2650._4_4_;
      fStack_1308 = fStack_12c8 * (float)uStack_2648;
      local_1340[0] = -0.24999994;
      local_1340[1] = -0.24999994;
      afStack_1338[0] = -0.24999994;
      afStack_1338[1] = -0.24999994;
      afStack_1330[0] = -0.24999994;
      afStack_1330[1] = -0.24999994;
      afStack_1328[0] = -0.24999994;
      afStack_1328[1] = -0.24999994;
      local_1380 = local_1320 + -0.24999994;
      fStack_137c = fStack_131c + -0.24999994;
      fStack_1378 = fStack_1318 + -0.24999994;
      fStack_1374 = fStack_1314 + -0.24999994;
      fStack_1370 = fStack_1310 + -0.24999994;
      fStack_136c = fStack_130c + -0.24999994;
      fStack_1368 = fStack_1308 + -0.24999994;
      uStack_13a4 = 0xbe0169fa;
      local_13e8 = local_28c0;
      local_13f0 = local_27c0;
      local_13f8 = ::_ps256_cephes_log_p8;
      local_13a0 = local_27c0;
      uStack_1398 = uStack_27b8;
      uStack_1390 = uStack_27b0;
      uStack_1388 = uStack_27a8;
      local_13c0 = local_1380 * (float)local_2660;
      fStack_13bc = fStack_137c * local_2660._4_4_;
      fStack_13b8 = fStack_1378 * (float)uStack_2658;
      fStack_13b4 = fStack_1374 * uStack_2658._4_4_;
      fStack_13b0 = fStack_1370 * (float)uStack_2650;
      fStack_13ac = fStack_136c * uStack_2650._4_4_;
      fStack_13a8 = fStack_1368 * (float)uStack_2648;
      local_13e0[0] = 0.3333333;
      local_13e0[1] = 0.3333333;
      afStack_13d8[0] = 0.3333333;
      afStack_13d8[1] = 0.3333333;
      afStack_13d0[0] = 0.3333333;
      afStack_13d0[1] = 0.3333333;
      afStack_13c8[0] = 0.3333333;
      afStack_13c8[1] = 0.3333333;
      local_28c0._4_4_ = fStack_13bc + 0.3333333;
      local_28c0._0_4_ = local_13c0 + 0.3333333;
      uStack_28b8._0_4_ = fStack_13b8 + 0.3333333;
      uStack_28b8._4_4_ = fStack_13b4 + 0.3333333;
      uStack_28b0._0_4_ = fStack_13b0 + 0.3333333;
      uStack_28b0._4_4_ = fStack_13ac + 0.3333333;
      auVar74 = _local_28c0;
      uStack_28a8._0_4_ = fStack_13a8 + 0.3333333;
      uStack_28a8._4_4_ = 0x3e53eb5a;
      auVar1 = _local_28c0;
      local_1a00 = local_28c0;
      uStack_19f8 = uStack_28b8;
      uStack_28b0 = auVar74._16_8_;
      uStack_19f0 = uStack_28b0;
      uStack_28a8 = auVar1._24_8_;
      uStack_19e8 = uStack_28a8;
      local_1a20 = local_27c0;
      uStack_1a18 = uStack_27b8;
      uStack_1a10 = uStack_27b0;
      uStack_1a08 = uStack_27a8;
      local_28c0._0_4_ = (local_13c0 + 0.3333333) * (float)local_2660;
      local_28c0._4_4_ = (fStack_13bc + 0.3333333) * local_2660._4_4_;
      fVar65 = (fStack_13b8 + 0.3333333) * (float)uStack_2658;
      fVar66 = (fStack_13b4 + 0.3333333) * uStack_2658._4_4_;
      fVar67 = (fStack_13b0 + 0.3333333) * (float)uStack_2650;
      fVar68 = (fStack_13ac + 0.3333333) * uStack_2650._4_4_;
      fVar69 = (fStack_13a8 + 0.3333333) * (float)uStack_2648;
      uStack_28b8._0_4_ = fVar65;
      uStack_28b8._4_4_ = fVar66;
      uStack_28b0._0_4_ = fVar67;
      uStack_28b0._4_4_ = fVar68;
      auVar74 = _local_28c0;
      uStack_28a8._0_4_ = fVar69;
      uStack_28a8._4_4_ = 0x3e53eb5a;
      auVar1 = _local_28c0;
      local_1a40 = local_28c0;
      uStack_1a38 = uStack_28b8;
      uStack_28b0 = auVar74._16_8_;
      uStack_1a30 = uStack_28b0;
      uStack_28a8 = auVar1._24_8_;
      uStack_1a28 = uStack_28a8;
      local_1a60 = CONCAT44(fStack_289c,local_28a0);
      uStack_1a58 = CONCAT44(fStack_2894,fStack_2898);
      uStack_1a50 = CONCAT44(fStack_288c,fStack_2890);
      uStack_1a48 = CONCAT44(fStack_2884,fStack_2888);
      local_28c0._0_4_ = (float)local_28c0._0_4_ * local_28a0;
      local_28c0._4_4_ = (float)local_28c0._4_4_ * fStack_289c;
      fVar65 = fVar65 * fStack_2898;
      fVar66 = fVar66 * fStack_2894;
      fVar67 = fVar67 * fStack_2890;
      fVar68 = fVar68 * fStack_288c;
      fVar69 = fVar69 * fStack_2888;
      uStack_28b8._0_4_ = fVar65;
      uStack_28b8._4_4_ = fVar66;
      uStack_28b0._0_4_ = fVar67;
      uStack_28b0._4_4_ = fVar68;
      auVar74 = _local_28c0;
      uStack_28a8._0_4_ = fVar69;
      uStack_28a8._4_4_ = 0x3e53eb5a;
      auVar1 = _local_28c0;
      local_1488 = local_2840;
      local_1490 = ::_ps256_cephes_log_q1;
      local_1498 = local_28c0;
      local_1420 = (float)local_2840._0_4_;
      fStack_141c = (float)local_2840._4_4_;
      fStack_1418 = (float)uStack_2838;
      fStack_1414 = uStack_2838._4_4_;
      fStack_1410 = (float)uStack_2830;
      fStack_140c = uStack_2830._4_4_;
      fStack_1408 = (float)uStack_2828;
      fStack_1444 = uStack_2828._4_4_;
      local_1440[0] = -0.00021219444;
      local_1440[1] = -0.00021219444;
      afStack_1438[0] = -0.00021219444;
      afStack_1438[1] = -0.00021219444;
      afStack_1430[0] = -0.00021219444;
      afStack_1430[1] = -0.00021219444;
      afStack_1428[0] = -0.00021219444;
      afStack_1428[1] = -0.00021219444;
      local_1460 = (float)local_2840._0_4_ * -0.00021219444;
      fStack_145c = (float)local_2840._4_4_ * -0.00021219444;
      fStack_1458 = (float)uStack_2838 * -0.00021219444;
      fStack_1454 = uStack_2838._4_4_ * -0.00021219444;
      fStack_1450 = (float)uStack_2830 * -0.00021219444;
      fStack_144c = uStack_2830._4_4_ * -0.00021219444;
      fStack_1448 = (float)uStack_2828 * -0.00021219444;
      local_1480 = local_28c0;
      uStack_1478 = uStack_28b8;
      uStack_28b0 = auVar74._16_8_;
      uStack_1470 = uStack_28b0;
      uStack_28a8 = auVar1._24_8_;
      uStack_1468 = uStack_28a8;
      local_28c0._4_4_ = fStack_145c + (float)local_28c0._4_4_;
      local_28c0._0_4_ = local_1460 + (float)local_28c0._0_4_;
      uStack_28b8._0_4_ = fStack_1458 + fVar65;
      uStack_28b8._4_4_ = fStack_1454 + fVar66;
      uStack_28b0._0_4_ = fStack_1450 + fVar67;
      uStack_28b0._4_4_ = fStack_144c + fVar68;
      auVar74 = _local_28c0;
      uStack_28a8._0_4_ = fStack_1448 + fVar69;
      uStack_28a8._4_4_ = uStack_2828._4_4_ + 0.20695248;
      auVar1 = _local_28c0;
      local_da8 = &local_28a0;
      local_db0 = ::_ps256_0p5;
      local_db8 = local_28c0;
      local_d80 = local_28c0;
      uStack_d78 = uStack_28b8;
      uStack_28b0 = auVar74._16_8_;
      uStack_d70 = uStack_28b0;
      uStack_28a8 = auVar1._24_8_;
      uStack_d68 = uStack_28a8;
      local_d40 = CONCAT44(fStack_289c,local_28a0);
      uStack_d38 = CONCAT44(fStack_2894,fStack_2898);
      uStack_d30 = CONCAT44(fStack_288c,fStack_2890);
      uStack_d28 = CONCAT44(fStack_2884,fStack_2888);
      local_d60[0] = 0.5;
      local_d60[1] = 0.5;
      afStack_d58[0] = 0.5;
      afStack_d58[1] = 0.5;
      afStack_d50[0] = 0.5;
      afStack_d50[1] = 0.5;
      afStack_d48[0] = 0.5;
      afStack_d48[1] = 0.5;
      local_da0 = local_28a0 * 0.5;
      fStack_d9c = fStack_289c * 0.5;
      fStack_d98 = fStack_2898 * 0.5;
      fStack_d94 = fStack_2894 * 0.5;
      fStack_d90 = fStack_2890 * 0.5;
      fStack_d8c = fStack_288c * 0.5;
      fStack_d88 = fStack_2888 * 0.5;
      auVar44._4_4_ = fStack_d9c;
      auVar44._0_4_ = local_da0;
      auVar44._8_4_ = fStack_d98;
      auVar44._12_4_ = fStack_d94;
      auVar44._16_4_ = fStack_d90;
      auVar44._20_4_ = fStack_d8c;
      auVar44._24_4_ = fStack_d88;
      auVar44._28_4_ = fStack_2884;
      auVar1 = vsubps_avx(auVar1,auVar44);
      local_26a0 = local_27c0;
      uStack_2698 = uStack_27b8;
      uStack_2690 = uStack_27b0;
      uStack_2688 = uStack_27a8;
      local_28c0 = auVar1._0_8_;
      uVar21 = local_28c0;
      uStack_28b8 = auVar1._8_8_;
      uVar22 = uStack_28b8;
      uStack_28b0 = auVar1._16_8_;
      uVar23 = uStack_28b0;
      uStack_28a8 = auVar1._24_8_;
      uVar24 = uStack_28a8;
      local_26c0._0_4_ = auVar1._0_4_;
      local_26c0._4_4_ = auVar1._4_4_;
      uStack_26b8._0_4_ = auVar1._8_4_;
      uStack_26b8._4_4_ = auVar1._12_4_;
      uStack_26b0._0_4_ = auVar1._16_4_;
      uStack_26b0._4_4_ = auVar1._20_4_;
      uStack_26a8._0_4_ = auVar1._24_4_;
      uStack_26a8._4_4_ = auVar1._28_4_;
      local_27c0._4_4_ = local_2660._4_4_ + local_26c0._4_4_;
      local_27c0._0_4_ = (float)local_2660 + (float)local_26c0;
      uStack_27b8._0_4_ = (float)uStack_2658 + (float)uStack_26b8;
      uStack_27b8._4_4_ = uStack_2658._4_4_ + uStack_26b8._4_4_;
      uStack_27b0._0_4_ = (float)uStack_2650 + (float)uStack_26b0;
      uStack_27b0._4_4_ = uStack_2650._4_4_ + uStack_26b0._4_4_;
      auVar74 = _local_27c0;
      uStack_27a8._0_4_ = (float)uStack_2648 + (float)uStack_26a8;
      uStack_27a8._4_4_ = fStack_2884 + uStack_26a8._4_4_;
      auVar1 = _local_27c0;
      local_1528 = local_2840;
      local_1530 = ::_ps256_cephes_log_q2;
      local_1538 = local_27c0;
      local_14c0 = (float)local_2840._0_4_;
      fStack_14bc = (float)local_2840._4_4_;
      fStack_14b8 = (float)uStack_2838;
      fStack_14b4 = uStack_2838._4_4_;
      fStack_14b0 = (float)uStack_2830;
      fStack_14ac = uStack_2830._4_4_;
      fStack_14a8 = (float)uStack_2828;
      fStack_14e4 = uStack_2828._4_4_;
      local_14e0[0] = 0.6933594;
      local_14e0[1] = 0.6933594;
      afStack_14d8[0] = 0.6933594;
      afStack_14d8[1] = 0.6933594;
      afStack_14d0[0] = 0.6933594;
      afStack_14d0[1] = 0.6933594;
      afStack_14c8[0] = 0.6933594;
      afStack_14c8[1] = 0.6933594;
      local_1500 = (float)local_2840._0_4_ * 0.6933594;
      fStack_14fc = (float)local_2840._4_4_ * 0.6933594;
      fStack_14f8 = (float)uStack_2838 * 0.6933594;
      fStack_14f4 = uStack_2838._4_4_ * 0.6933594;
      fStack_14f0 = (float)uStack_2830 * 0.6933594;
      fStack_14ec = uStack_2830._4_4_ * 0.6933594;
      fStack_14e8 = (float)uStack_2828 * 0.6933594;
      local_1520 = local_27c0;
      uStack_1518 = uStack_27b8;
      uStack_27b0 = auVar74._16_8_;
      uStack_1510 = uStack_27b0;
      uStack_27a8 = auVar1._24_8_;
      uStack_1508 = uStack_27a8;
      local_27c0._4_4_ = fStack_14fc + local_2660._4_4_ + local_26c0._4_4_;
      local_27c0._0_4_ = local_1500 + (float)local_2660 + (float)local_26c0;
      uStack_27b8._0_4_ = fStack_14f8 + (float)uStack_2658 + (float)uStack_26b8;
      uStack_27b8._4_4_ = fStack_14f4 + uStack_2658._4_4_ + uStack_26b8._4_4_;
      uStack_27b0._0_4_ = fStack_14f0 + (float)uStack_2650 + (float)uStack_26b0;
      uStack_27b0._4_4_ = fStack_14ec + uStack_2650._4_4_ + uStack_26b0._4_4_;
      auVar74 = _local_27c0;
      uStack_27a8._0_4_ = fStack_14e8 + (float)uStack_2648 + (float)uStack_26a8;
      uStack_27a8._4_4_ = uStack_2828._4_4_ + fStack_2884 + uStack_26a8._4_4_;
      auVar6 = _local_27c0;
      local_1c60 = local_27c0;
      uStack_1c58 = uStack_27b8;
      uStack_27b0 = auVar74._16_8_;
      uStack_1c50 = uStack_27b0;
      uStack_27a8 = auVar6._24_8_;
      uStack_1c48 = uStack_27a8;
      local_1c80 = local_2820._0_8_;
      uStack_1c78 = local_2820._8_8_;
      uStack_1c70 = local_2820._16_8_;
      uStack_1c68 = local_2820._24_8_;
      auVar39._16_8_ = uStack_27b0;
      auVar39._0_16_ = _local_27c0;
      auVar39._24_8_ = uStack_27a8;
      _local_28c0 = vorps_avx(auVar39,local_2820);
      local_2b00 = auVar2._0_8_;
      local_2940 = local_2b00;
      uStack_2af8 = auVar2._8_8_;
      uStack_2938 = uStack_2af8;
      uStack_2af0 = auVar2._16_8_;
      uStack_2930 = uStack_2af0;
      uStack_2ae8 = auVar2._24_8_;
      uStack_2928 = uStack_2ae8;
      auVar1 = vandps_avx(*local_2a20,auVar2);
      local_2b60 = auVar1._0_8_;
      uStack_2b58 = auVar1._8_8_;
      uStack_2b50 = auVar1._16_8_;
      uStack_2b48 = auVar1._24_8_;
      local_25e0._0_4_ = auVar1._0_4_;
      local_25e0._4_4_ = auVar1._4_4_;
      uStack_25d8._0_4_ = auVar1._8_4_;
      uStack_25d8._4_4_ = auVar1._12_4_;
      uStack_25d0._0_4_ = auVar1._16_4_;
      uStack_25d0._4_4_ = auVar1._20_4_;
      uStack_25c8._0_4_ = auVar1._24_4_;
      uStack_25c8._4_4_ = auVar1._28_4_;
      local_2600._0_4_ = local_28c0._0_4_;
      local_2600._4_4_ = local_28c0._4_4_;
      uStack_25f8._0_4_ = local_28c0._8_4_;
      uStack_25f8._4_4_ = local_28c0._12_4_;
      uStack_25f0._0_4_ = local_28c0._16_4_;
      uStack_25f0._4_4_ = local_28c0._20_4_;
      uStack_25e8._0_4_ = local_28c0._24_4_;
      uStack_25e8._4_4_ = local_28c0._28_4_;
      local_22a8 = local_2a20;
      local_22e0 = CONCAT44(local_25e0._4_4_ + local_2600._4_4_,
                            (float)local_25e0 + (float)local_2600);
      uStack_22d8 = CONCAT44(uStack_25d8._4_4_ + uStack_25f8._4_4_,
                             (float)uStack_25d8 + (float)uStack_25f8);
      uStack_22d0 = CONCAT44(uStack_25d0._4_4_ + uStack_25f0._4_4_,
                             (float)uStack_25d0 + (float)uStack_25f0);
      uStack_22c8 = CONCAT44(uStack_25c8._4_4_ + uStack_25e8._4_4_,
                             (float)uStack_25c8 + (float)uStack_25e8);
      *(undefined8 *)*local_2a20 = local_22e0;
      *(undefined8 *)(*local_2a20 + 8) = uStack_22d8;
      *(undefined8 *)(*local_2a20 + 0x10) = uStack_22d0;
      *(undefined8 *)(*local_2a20 + 0x18) = uStack_22c8;
      local_2a20 = local_2a20 + 1;
      local_28e0 = local_2920;
      uStack_28d8 = uStack_2918;
      uStack_28d0 = uStack_2910;
      uStack_28c8 = uStack_2908;
      _local_27c0 = auVar6;
      local_26c0 = uVar21;
      uStack_26b8 = uVar22;
      uStack_26b0 = uVar23;
      uStack_26a8 = uVar24;
      local_2680 = local_2880._0_8_;
      uStack_2678 = local_2880._8_8_;
      uStack_2670 = local_2880._16_8_;
      uStack_2668 = local_2880._24_8_;
      local_2660 = uVar17;
      uStack_2658 = uVar18;
      uStack_2650 = uVar19;
      uStack_2648 = uVar20;
      local_2620 = uVar13;
      uStack_2618 = uVar14;
      uStack_2610 = uVar15;
      uStack_2608 = uVar16;
      local_2600 = local_28c0;
      uStack_25f8 = uStack_28b8;
      uStack_25f0 = uStack_28b0;
      uStack_25e8 = uStack_28a8;
      local_25e0 = local_2b60;
      uStack_25d8 = uStack_2b58;
      uStack_25d0 = uStack_2b50;
      uStack_25c8 = uStack_2b48;
      local_25a0 = local_1e20._0_8_;
      uStack_2598 = local_1e20._8_8_;
      uStack_2590 = auStack_1e10._0_8_;
      uStack_2588 = auStack_1e10._8_8_;
      local_2520 = local_2800;
      uStack_2518 = uStack_27f8;
      uStack_2510 = uStack_27f0;
      uStack_2508 = uStack_27e8;
      _local_24c0 = auVar26;
      local_2480 = local_29a0;
      local_1d80 = auVar73._0_8_;
      local_1a80 = local_1aa0;
      uStack_1a78 = uStack_1a98;
      uStack_1a70 = uStack_1a90;
      uStack_1a68 = uStack_1a88;
      local_19c0 = local_19e0;
      uStack_19b8 = uStack_19d8;
      uStack_19b0 = uStack_19d0;
      uStack_19a8 = uStack_19c8;
      local_18f0 = local_1998;
      local_18e8 = local_1988;
      local_1850 = local_1998;
      local_1848 = local_1988;
      local_17b0 = local_1998;
      local_17a8 = local_1988;
      local_1710 = local_1998;
      local_1708 = local_1988;
      local_1670 = local_1998;
      local_1668 = local_1988;
      local_15c8 = local_1998;
      local_1560 = uVar9;
      uStack_1558 = uVar10;
      uStack_1550 = uVar11;
      uStack_1548 = uVar12;
      fStack_14a4 = fStack_14e4;
      fStack_1404 = fStack_1444;
      uStack_1364 = uStack_13a4;
      uStack_12c4 = uStack_1304;
      uStack_1224 = uStack_1264;
      uStack_1184 = uStack_11c4;
      uStack_10e4 = uStack_1124;
      uStack_1044 = uStack_1084;
      uStack_fa4 = uStack_fe4;
      uStack_f04 = uStack_f44;
      local_ef8 = local_1998;
      local_e58 = local_1998;
      local_e48 = local_ee8;
      local_de0 = local_24e0;
      uStack_dd8 = uStack_24d8;
      uStack_dd0 = uStack_24d0;
      uStack_dc8 = uStack_24c8;
      fStack_d84 = fStack_2884;
      local_b40 = local_1b40;
      uStack_b38 = uStack_1b38;
      uStack_b30 = uStack_1b30;
      uStack_b28 = uStack_1b28;
    }
    local_2284 = 0x3f800000;
    local_22a0 = 0x3f800000;
    uStack_229c = 0x3f800000;
    uStack_2298 = 0x3f800000;
    uStack_2294 = 0x3f800000;
    local_2280._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_2980 = ZEXT832(0) << 0x20, auVar4 = ZEXT816(0) << 0x20, local_1e50 = local_29b8,
        local_2a48 = local_1eb0, local_2a78 + 3 < local_2a10; local_2a78 = local_2a78 + 4) {
      local_2268 = local_2a20;
      local_2250 = *(undefined8 *)*local_2a20;
      uStack_2248 = *(undefined8 *)(*local_2a20 + 8);
      local_2260 = 0;
      uStack_2258 = local_2280._8_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_2280._8_8_;
      auVar4 = vcmpps_avx(auVar63 << 0x40,*(undefined1 (*) [16])*local_2a20,1);
      local_2220[0] = 0x7fffffff;
      local_2220[1] = 0x7fffffff;
      aiStack_2218[0] = 0x7fffffff;
      aiStack_2218[1] = 0x7fffffff;
      auVar29._8_4_ = 0x7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar29._0_4_ = 0x7fffffff;
      auVar29._4_4_ = 0x7fffffff;
      auVar7 = vpand_avx(*(undefined1 (*) [16])*local_2a20,auVar29);
      local_1ee0 = 0;
      uStack_1ed8 = local_2280._8_8_;
      local_2bb0 = auVar7._0_8_;
      local_1ef0 = local_2bb0;
      uStack_2ba8 = auVar7._8_8_;
      uStack_1ee8 = uStack_2ba8;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_2280._8_8_;
      auVar7 = vsubps_avx(auVar64 << 0x40,auVar7);
      local_1fe0 = 0;
      uStack_1fd8 = 0;
      local_21a0 = 0x3f8000003f800000;
      uStack_2198 = 0x3f8000003f800000;
      local_1ff0._0_8_ = auVar7._0_8_;
      local_70 = local_1ff0._0_8_;
      local_1ff0._8_8_ = auVar7._8_8_;
      uStack_68 = local_1ff0._8_8_;
      local_80 = 0x42b0c0a542b0c0a5;
      uStack_78 = 0x42b0c0a542b0c0a5;
      auVar62._8_8_ = 0x42b0c0a542b0c0a5;
      auVar62._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar7,auVar62);
      local_1ff0._0_8_ = auVar7._0_8_;
      local_920 = local_1ff0._0_8_;
      local_1ff0._8_8_ = auVar7._8_8_;
      uStack_918 = local_1ff0._8_8_;
      local_930 = 0xc2b0c0a5c2b0c0a5;
      uStack_928 = 0xc2b0c0a5c2b0c0a5;
      auVar52._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar7,auVar52);
      local_1ff0._0_8_ = auVar5._0_8_;
      uVar9 = local_1ff0._0_8_;
      local_1ff0._8_8_ = auVar5._8_8_;
      uVar10 = local_1ff0._8_8_;
      local_820 = 0x3fb8aa3b3fb8aa3b;
      uStack_818 = 0x3fb8aa3b3fb8aa3b;
      local_810._0_4_ = auVar5._0_4_;
      local_810._4_4_ = auVar5._4_4_;
      uStack_808._0_4_ = auVar5._8_4_;
      uStack_808._4_4_ = auVar5._12_4_;
      local_2010._4_4_ = local_810._4_4_ * 1.442695;
      local_2010._0_4_ = (float)local_810 * 1.442695;
      uStack_2008._0_4_ = (float)uStack_808 * 1.442695;
      uStack_2008._4_4_ = uStack_808._4_4_ * 1.442695;
      local_1f60 = local_2010;
      uStack_1f58 = uStack_2008;
      local_1f70 = 0x3f0000003f000000;
      uStack_1f68 = 0x3f0000003f000000;
      local_2010._0_4_ = (float)local_810 * 1.442695 + 0.5;
      local_2010._4_4_ = local_810._4_4_ * 1.442695 + 0.5;
      fVar65 = (float)uStack_808 * 1.442695 + 0.5;
      fVar66 = uStack_808._4_4_ * 1.442695 + 0.5;
      uStack_2008._0_4_ = fVar65;
      uStack_2008._4_4_ = fVar66;
      local_50 = local_2010;
      uStack_48 = uStack_2008;
      local_2020._4_4_ = (int)(float)local_2010._4_4_;
      local_2020._0_4_ = (int)(float)local_2010._0_4_;
      local_2020._8_4_ = (int)fVar65;
      local_2020._12_4_ = (int)fVar66;
      local_8a0 = local_2020._0_8_;
      uStack_898 = local_2020._8_8_;
      auVar57._8_8_ = local_2020._8_8_;
      auVar57._0_8_ = local_2020._0_8_;
      auVar3 = vcvtdq2ps_avx(auVar57);
      local_2000 = auVar3._0_8_;
      local_1fc0 = local_2000;
      uStack_1ff8 = auVar3._8_8_;
      uStack_1fb8 = uStack_1ff8;
      local_1fd0 = local_2010;
      uStack_1fc8 = uStack_2008;
      auVar32._8_8_ = uStack_2008;
      auVar32._0_8_ = local_2010;
      auVar7 = vcmpps_avx(auVar32,auVar3,1);
      local_2040._0_8_ = auVar7._0_8_;
      local_1fa0 = local_2040._0_8_;
      local_2040._8_8_ = auVar7._8_8_;
      uStack_1f98 = local_2040._8_8_;
      local_1fb0 = 0x3f8000003f800000;
      uStack_1fa8 = 0x3f8000003f800000;
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      local_2040 = vpand_avx(auVar7,auVar33);
      local_1f40 = local_2000;
      uStack_1f38 = uStack_1ff8;
      local_1f50 = local_2040._0_8_;
      uStack_1f48 = local_2040._8_8_;
      _local_2010 = vsubps_avx(auVar3,local_2040);
      local_188 = local_2010;
      local_130 = ::_ps_cephes_exp_C1;
      local_798 = local_1ff0;
      local_110 = local_1ff0._0_8_;
      uStack_108 = local_1ff0._8_8_;
      local_100[0] = 0.6933594;
      local_100[1] = 0.6933594;
      afStack_f8[0] = 0.6933594;
      afStack_f8[1] = 0.6933594;
      local_f0._0_4_ = local_2010._0_4_;
      local_f0._4_4_ = local_2010._4_4_;
      uStack_e8._0_4_ = local_2010._8_4_;
      uStack_e8._4_4_ = local_2010._12_4_;
      local_120 = (float)local_f0 * 0.6933594;
      fStack_11c = local_f0._4_4_ * 0.6933594;
      fStack_118 = (float)uStack_e8 * 0.6933594;
      fStack_114 = uStack_e8._4_4_ * 0.6933594;
      auVar60._4_4_ = fStack_11c;
      auVar60._0_4_ = local_120;
      auVar60._8_4_ = fStack_118;
      auVar60._12_4_ = fStack_114;
      auVar7 = vsubps_avx(auVar5,auVar60);
      local_190 = ::_ps_cephes_exp_C2;
      local_1ff0._0_8_ = auVar7._0_8_;
      local_170 = local_1ff0._0_8_;
      local_1ff0._8_8_ = auVar7._8_8_;
      uStack_168 = local_1ff0._8_8_;
      local_150 = local_2010;
      uStack_148 = uStack_2008;
      local_160[0] = -0.00021219444;
      local_160[1] = -0.00021219444;
      afStack_158[0] = -0.00021219444;
      afStack_158[1] = -0.00021219444;
      local_180 = (float)local_f0 * -0.00021219444;
      fStack_17c = local_f0._4_4_ * -0.00021219444;
      fStack_178 = (float)uStack_e8 * -0.00021219444;
      fStack_174 = uStack_e8._4_4_ * -0.00021219444;
      auVar59._4_4_ = fStack_17c;
      auVar59._0_4_ = local_180;
      auVar59._8_4_ = fStack_178;
      auVar59._12_4_ = fStack_174;
      local_1ff0 = vsubps_avx(auVar7,auVar59);
      local_840 = local_1ff0._0_8_;
      uStack_838 = local_1ff0._8_8_;
      local_830._0_4_ = local_1ff0._0_4_;
      local_830._4_4_ = local_1ff0._4_4_;
      uStack_828._0_4_ = local_1ff0._8_4_;
      uStack_828._4_4_ = local_1ff0._12_4_;
      local_2000 = CONCAT44(local_830._4_4_ * local_830._4_4_,(float)local_830 * (float)local_830);
      uStack_1ff8._0_4_ = (float)uStack_828 * (float)uStack_828;
      uStack_1ff8._4_4_ = uStack_828._4_4_ * uStack_828._4_4_;
      local_788 = &local_2050;
      local_5b8 = ::_ps_cephes_exp_p1;
      local_570 = 0x3950696739506967;
      uStack_568 = 0x3950696739506967;
      local_580 = local_1ff0._0_8_;
      uStack_578 = local_1ff0._8_8_;
      local_590 = (float)local_830 * 0.00019875691;
      fStack_58c = local_830._4_4_ * 0.00019875691;
      fStack_588 = (float)uStack_828 * 0.00019875691;
      fStack_584 = uStack_828._4_4_ * 0.00019875691;
      local_5a0[0] = 0.0013981999;
      local_5a0[1] = 0.0013981999;
      afStack_598[0] = 0.0013981999;
      afStack_598[1] = 0.0013981999;
      local_2050 = CONCAT44(fStack_58c + 0.0013981999,local_590 + 0.0013981999);
      uStack_2048 = CONCAT44(fStack_584 + 0.0013981999,fStack_588 + 0.0013981999);
      local_618 = ::_ps_cephes_exp_p2;
      local_5d0 = local_2050;
      uStack_5c8 = uStack_2048;
      local_5e0 = local_1ff0._0_8_;
      uStack_5d8 = local_1ff0._8_8_;
      local_5f0 = (local_590 + 0.0013981999) * (float)local_830;
      fStack_5ec = (fStack_58c + 0.0013981999) * local_830._4_4_;
      fStack_5e8 = (fStack_588 + 0.0013981999) * (float)uStack_828;
      fStack_5e4 = (fStack_584 + 0.0013981999) * uStack_828._4_4_;
      local_600[0] = 0.008333452;
      local_600[1] = 0.008333452;
      afStack_5f8[0] = 0.008333452;
      afStack_5f8[1] = 0.008333452;
      local_2050 = CONCAT44(fStack_5ec + 0.008333452,local_5f0 + 0.008333452);
      uStack_2048 = CONCAT44(fStack_5e4 + 0.008333452,fStack_5e8 + 0.008333452);
      local_678 = ::_ps_cephes_exp_p3;
      local_630 = local_2050;
      uStack_628 = uStack_2048;
      local_640 = local_1ff0._0_8_;
      uStack_638 = local_1ff0._8_8_;
      local_650 = (local_5f0 + 0.008333452) * (float)local_830;
      fStack_64c = (fStack_5ec + 0.008333452) * local_830._4_4_;
      fStack_648 = (fStack_5e8 + 0.008333452) * (float)uStack_828;
      fStack_644 = (fStack_5e4 + 0.008333452) * uStack_828._4_4_;
      local_660[0] = 0.041665796;
      local_660[1] = 0.041665796;
      afStack_658[0] = 0.041665796;
      afStack_658[1] = 0.041665796;
      local_2050 = CONCAT44(fStack_64c + 0.041665796,local_650 + 0.041665796);
      uStack_2048 = CONCAT44(fStack_644 + 0.041665796,fStack_648 + 0.041665796);
      local_6d8 = ::_ps_cephes_exp_p4;
      local_690 = local_2050;
      uStack_688 = uStack_2048;
      local_6a0 = local_1ff0._0_8_;
      uStack_698 = local_1ff0._8_8_;
      local_6b0 = (local_650 + 0.041665796) * (float)local_830;
      fStack_6ac = (fStack_64c + 0.041665796) * local_830._4_4_;
      fStack_6a8 = (fStack_648 + 0.041665796) * (float)uStack_828;
      fStack_6a4 = (fStack_644 + 0.041665796) * uStack_828._4_4_;
      local_6c0[0] = 0.16666666;
      local_6c0[1] = 0.16666666;
      afStack_6b8[0] = 0.16666666;
      afStack_6b8[1] = 0.16666666;
      local_2050 = CONCAT44(fStack_6ac + 0.16666666,local_6b0 + 0.16666666);
      uStack_2048 = CONCAT44(fStack_6a4 + 0.16666666,fStack_6a8 + 0.16666666);
      local_738 = ::_ps_cephes_exp_p5;
      local_6f0 = local_2050;
      uStack_6e8 = uStack_2048;
      local_700 = local_1ff0._0_8_;
      uStack_6f8 = local_1ff0._8_8_;
      local_710 = (local_6b0 + 0.16666666) * (float)local_830;
      fStack_70c = (fStack_6ac + 0.16666666) * local_830._4_4_;
      fStack_708 = (fStack_6a8 + 0.16666666) * (float)uStack_828;
      fStack_704 = (fStack_6a4 + 0.16666666) * uStack_828._4_4_;
      local_720[0] = 0.5;
      local_720[1] = 0.5;
      afStack_718[0] = 0.5;
      afStack_718[1] = 0.5;
      local_2050 = CONCAT44(fStack_70c + 0.5,local_710 + 0.5);
      uStack_2048 = CONCAT44(fStack_704 + 0.5,fStack_708 + 0.5);
      local_790 = &local_2000;
      local_750 = local_2050;
      uStack_748 = uStack_2048;
      local_760 = local_2000;
      uStack_758 = uStack_1ff8;
      local_770 = (local_710 + 0.5) * (float)local_830 * (float)local_830;
      fStack_76c = (fStack_70c + 0.5) * local_830._4_4_ * local_830._4_4_;
      fStack_768 = (fStack_708 + 0.5) * (float)uStack_828 * (float)uStack_828;
      fStack_764 = (fStack_704 + 0.5) * uStack_828._4_4_ * uStack_828._4_4_;
      local_780 = local_1ff0._0_8_;
      uStack_778 = local_1ff0._8_8_;
      local_2050 = CONCAT44(fStack_76c + local_830._4_4_,local_770 + (float)local_830);
      uStack_2048 = CONCAT44(fStack_764 + uStack_828._4_4_,fStack_768 + (float)uStack_828);
      local_1f80 = local_2050;
      uStack_1f78 = uStack_2048;
      local_1f90 = 0x3f8000003f800000;
      uStack_1f88 = 0x3f8000003f800000;
      fVar65 = local_770 + (float)local_830 + 1.0;
      fVar66 = fStack_76c + local_830._4_4_ + 1.0;
      fVar67 = fStack_768 + (float)uStack_828 + 1.0;
      fVar68 = fStack_764 + uStack_828._4_4_ + 1.0;
      local_2050 = CONCAT44(fVar66,fVar65);
      uStack_2048 = CONCAT44(fVar68,fVar67);
      local_60 = local_2010;
      uStack_58 = uStack_2008;
      local_2020._4_4_ = (int)local_f0._4_4_;
      local_2020._0_4_ = (int)(float)local_f0;
      local_2020._8_4_ = (int)(float)uStack_e8;
      local_2020._12_4_ = (int)uStack_e8._4_4_;
      local_9c0 = local_2020._0_8_;
      uStack_9b8 = local_2020._8_8_;
      local_c80 = 0x7f0000007f;
      uStack_c78 = 0x7f0000007f;
      auVar50._8_8_ = local_2020._8_8_;
      auVar50._0_8_ = local_2020._0_8_;
      auVar49._8_8_ = 0x7f0000007f;
      auVar49._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar50,auVar49);
      local_2020._0_8_ = auVar7._0_8_;
      local_960 = local_2020._0_8_;
      local_2020._8_8_ = auVar7._8_8_;
      uStack_958 = local_2020._8_8_;
      local_964 = 0x17;
      local_2020 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_40 = local_2020._0_8_;
      uStack_38 = local_2020._8_8_;
      local_2060 = local_2020._0_8_;
      uStack_2058 = local_2020._8_8_;
      local_850 = local_2050;
      uStack_848 = uStack_2048;
      local_860 = local_2020._0_8_;
      uStack_858 = local_2020._8_8_;
      fVar65 = fVar65 * local_2020._0_4_;
      fVar66 = fVar66 * local_2020._4_4_;
      fVar67 = fVar67 * local_2020._8_4_;
      fVar68 = fVar68 * local_2020._12_4_;
      local_2050 = CONCAT44(fVar66,fVar65);
      uStack_2048 = CONCAT44(fVar68,fVar67);
      local_2080 = local_2050;
      uStack_2078 = uStack_2048;
      auVar76._0_8_ = CONCAT44(fVar66 + 1.0,fVar65 + 1.0);
      auVar76._8_4_ = fVar67 + 1.0;
      auVar76._12_4_ = fVar68 + 1.0;
      uStack_2178 = auVar76._8_8_;
      uStack_938 = uStack_2178;
      local_2170 = 0;
      uStack_2168 = 0;
      local_950 = 0;
      uStack_948 = 0;
      auVar51._8_8_ = uStack_2178;
      auVar51._0_8_ = auVar76._0_8_;
      local_21b0 = vcmpps_avx(auVar51,ZEXT816(0),2);
      uStack_8f8 = uStack_2178;
      local_910 = 0x80000000800000;
      uStack_908 = 0x80000000800000;
      auVar54._8_8_ = uStack_2178;
      auVar54._0_8_ = auVar76._0_8_;
      auVar53._8_8_ = 0x80000000800000;
      auVar53._0_8_ = 0x80000000800000;
      auVar7 = vmaxps_avx(auVar54,auVar53);
      local_2180 = auVar7._0_8_;
      local_8f0 = local_2180;
      uStack_2178 = auVar7._8_8_;
      uStack_8e8 = uStack_2178;
      local_cd0 = local_2180;
      uStack_cc8 = uStack_2178;
      local_cd4 = 0x17;
      auVar5 = vpsrld_avx(auVar7,ZEXT416(0x17));
      local_2110 = local_2180;
      uStack_2108 = uStack_2178;
      local_2120 = 0x807fffff807fffff;
      uStack_2118 = 0x807fffff807fffff;
      auVar31._8_8_ = 0x807fffff807fffff;
      auVar31._0_8_ = 0x807fffff807fffff;
      auVar7 = vpand_avx(auVar7,auVar31);
      local_2180 = auVar7._0_8_;
      local_8b0 = local_2180;
      uStack_2178 = auVar7._8_8_;
      uStack_8a8 = uStack_2178;
      auVar56._8_8_ = 0x3f0000003f000000;
      auVar56._0_8_ = 0x3f0000003f000000;
      auVar3 = vpor_avx(auVar7,auVar56);
      local_2190._0_8_ = auVar5._0_8_;
      local_c70 = local_2190._0_8_;
      local_2190._8_8_ = auVar5._8_8_;
      uStack_c68 = local_2190._8_8_;
      auVar45._8_8_ = 0x7f0000007f;
      auVar45._0_8_ = 0x7f0000007f;
      local_2190 = vpsubd_avx(auVar5,auVar45);
      local_890 = local_2190._0_8_;
      uStack_888 = local_2190._8_8_;
      auVar7 = vcvtdq2ps_avx(local_2190);
      local_21c0 = auVar7._0_8_;
      uVar11 = local_21c0;
      uStack_21b8 = auVar7._8_8_;
      uVar12 = uStack_21b8;
      local_20c0 = 0x3f8000003f800000;
      uStack_20b8 = 0x3f8000003f800000;
      local_20b0._0_4_ = auVar7._0_4_;
      local_20b0._4_4_ = auVar7._4_4_;
      uStack_20a8._0_4_ = auVar7._8_4_;
      uStack_20a8._4_4_ = auVar7._12_4_;
      local_21c0._4_4_ = local_20b0._4_4_ + 1.0;
      local_21c0._0_4_ = (float)local_20b0 + 1.0;
      uStack_21b8._0_4_ = (float)uStack_20a8 + 1.0;
      uStack_21b8._4_4_ = uStack_20a8._4_4_ + 1.0;
      local_2180 = auVar3._0_8_;
      local_870 = local_2180;
      uStack_2178 = auVar3._8_8_;
      uStack_868 = uStack_2178;
      local_880 = 0x3f3504f33f3504f3;
      uStack_878 = 0x3f3504f33f3504f3;
      auVar58._8_8_ = 0x3f3504f33f3504f3;
      auVar58._0_8_ = 0x3f3504f33f3504f3;
      local_21d0 = vcmpps_avx(auVar3,auVar58,1);
      local_2130 = local_2180;
      uStack_2128 = uStack_2178;
      local_2140 = local_21d0._0_8_;
      uStack_2138 = local_21d0._8_8_;
      local_21e0 = vpand_avx(auVar3,local_21d0);
      local_1f00 = local_2180;
      uStack_1ef8 = uStack_2178;
      local_1f10 = 0x3f8000003f800000;
      uStack_1f08 = 0x3f8000003f800000;
      auVar35._8_8_ = 0x3f8000003f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar3,auVar35);
      local_1f20 = local_21c0;
      uStack_1f18 = uStack_21b8;
      local_2150 = 0x3f8000003f800000;
      uStack_2148 = 0x3f8000003f800000;
      local_2160 = local_21d0._0_8_;
      uStack_2158 = local_21d0._8_8_;
      auVar30._8_8_ = 0x3f8000003f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      local_1f30 = vpand_avx(auVar30,local_21d0);
      auVar34._8_8_ = uStack_21b8;
      auVar34._0_8_ = local_21c0;
      _local_21c0 = vsubps_avx(auVar34,local_1f30);
      local_2180 = auVar7._0_8_;
      uVar13 = local_2180;
      uStack_2178 = auVar7._8_8_;
      uVar14 = uStack_2178;
      local_20d0._0_4_ = auVar7._0_4_;
      local_20d0._4_4_ = auVar7._4_4_;
      uStack_20c8._0_4_ = auVar7._8_4_;
      uStack_20c8._4_4_ = auVar7._12_4_;
      local_20e0._0_4_ = local_21e0._0_4_;
      local_20e0._4_4_ = local_21e0._4_4_;
      uStack_20d8._0_4_ = local_21e0._8_4_;
      uStack_20d8._4_4_ = local_21e0._12_4_;
      local_20d0._0_4_ = (float)local_20d0 + (float)local_20e0;
      local_20d0._4_4_ = local_20d0._4_4_ + local_20e0._4_4_;
      uStack_20c8._0_4_ = (float)uStack_20c8 + (float)uStack_20d8;
      uStack_20c8._4_4_ = uStack_20c8._4_4_ + uStack_20d8._4_4_;
      local_2180._4_4_ = local_20d0._4_4_;
      local_2180._0_4_ = (float)local_20d0;
      uStack_2178._0_4_ = (float)uStack_20c8;
      uStack_2178._4_4_ = uStack_20c8._4_4_;
      local_7c0 = local_2180;
      uStack_7b8 = uStack_2178;
      local_21f0 = (float)local_20d0 * (float)local_20d0;
      fStack_21ec = local_20d0._4_4_ * local_20d0._4_4_;
      fStack_21e8 = (float)uStack_20c8 * (float)uStack_20c8;
      fStack_21e4 = uStack_20c8._4_4_ * uStack_20c8._4_4_;
      local_1e8 = local_2200;
      local_1f0 = local_2180;
      local_1f8 = ::_ps_cephes_log_p1;
      local_1b0 = 0x3d9021bb3d9021bb;
      uStack_1a8 = 0x3d9021bb3d9021bb;
      local_1c0 = local_2180;
      uStack_1b8 = uStack_2178;
      local_1d0 = (float)local_20d0 * 0.070376836;
      fStack_1cc = local_20d0._4_4_ * 0.070376836;
      fStack_1c8 = (float)uStack_20c8 * 0.070376836;
      fStack_1c4 = uStack_20c8._4_4_ * 0.070376836;
      local_1e0[0] = -0.1151461;
      local_1e0[1] = -0.1151461;
      afStack_1d8[0] = -0.1151461;
      afStack_1d8[1] = -0.1151461;
      local_2200._4_4_ = fStack_1cc + -0.1151461;
      local_2200._0_4_ = local_1d0 + -0.1151461;
      uStack_21f8._0_4_ = fStack_1c8 + -0.1151461;
      uStack_21f8._4_4_ = fStack_1c4 + -0.1151461;
      local_248 = local_2200;
      local_250 = local_2180;
      local_258 = ::_ps_cephes_log_p2;
      local_210 = local_2200;
      uStack_208 = uStack_21f8;
      local_220 = local_2180;
      uStack_218 = uStack_2178;
      local_230 = (local_1d0 + -0.1151461) * (float)local_20d0;
      fStack_22c = (fStack_1cc + -0.1151461) * local_20d0._4_4_;
      fStack_228 = (fStack_1c8 + -0.1151461) * (float)uStack_20c8;
      fStack_224 = (fStack_1c4 + -0.1151461) * uStack_20c8._4_4_;
      local_240[0] = 0.116769984;
      local_240[1] = 0.116769984;
      afStack_238[0] = 0.116769984;
      afStack_238[1] = 0.116769984;
      local_2200._4_4_ = fStack_22c + 0.116769984;
      local_2200._0_4_ = local_230 + 0.116769984;
      uStack_21f8._0_4_ = fStack_228 + 0.116769984;
      uStack_21f8._4_4_ = fStack_224 + 0.116769984;
      local_2a8 = local_2200;
      local_2b0 = local_2180;
      local_2b8 = ::_ps_cephes_log_p3;
      local_270 = local_2200;
      uStack_268 = uStack_21f8;
      local_280 = local_2180;
      uStack_278 = uStack_2178;
      local_290 = (local_230 + 0.116769984) * (float)local_20d0;
      fStack_28c = (fStack_22c + 0.116769984) * local_20d0._4_4_;
      fStack_288 = (fStack_228 + 0.116769984) * (float)uStack_20c8;
      fStack_284 = (fStack_224 + 0.116769984) * uStack_20c8._4_4_;
      local_2a0[0] = -0.12420141;
      local_2a0[1] = -0.12420141;
      afStack_298[0] = -0.12420141;
      afStack_298[1] = -0.12420141;
      local_2200._4_4_ = fStack_28c + -0.12420141;
      local_2200._0_4_ = local_290 + -0.12420141;
      uStack_21f8._0_4_ = fStack_288 + -0.12420141;
      uStack_21f8._4_4_ = fStack_284 + -0.12420141;
      local_308 = local_2200;
      local_310 = local_2180;
      local_318 = ::_ps_cephes_log_p4;
      local_2d0 = local_2200;
      uStack_2c8 = uStack_21f8;
      local_2e0 = local_2180;
      uStack_2d8 = uStack_2178;
      local_2f0 = (local_290 + -0.12420141) * (float)local_20d0;
      fStack_2ec = (fStack_28c + -0.12420141) * local_20d0._4_4_;
      fStack_2e8 = (fStack_288 + -0.12420141) * (float)uStack_20c8;
      fStack_2e4 = (fStack_284 + -0.12420141) * uStack_20c8._4_4_;
      local_300[0] = 0.14249323;
      local_300[1] = 0.14249323;
      afStack_2f8[0] = 0.14249323;
      afStack_2f8[1] = 0.14249323;
      local_2200._4_4_ = fStack_2ec + 0.14249323;
      local_2200._0_4_ = local_2f0 + 0.14249323;
      uStack_21f8._0_4_ = fStack_2e8 + 0.14249323;
      uStack_21f8._4_4_ = fStack_2e4 + 0.14249323;
      local_368 = local_2200;
      local_370 = local_2180;
      local_378 = ::_ps_cephes_log_p5;
      local_330 = local_2200;
      uStack_328 = uStack_21f8;
      local_340 = local_2180;
      uStack_338 = uStack_2178;
      local_350 = (local_2f0 + 0.14249323) * (float)local_20d0;
      fStack_34c = (fStack_2ec + 0.14249323) * local_20d0._4_4_;
      fStack_348 = (fStack_2e8 + 0.14249323) * (float)uStack_20c8;
      fStack_344 = (fStack_2e4 + 0.14249323) * uStack_20c8._4_4_;
      local_360[0] = -0.16668057;
      local_360[1] = -0.16668057;
      afStack_358[0] = -0.16668057;
      afStack_358[1] = -0.16668057;
      local_2200._4_4_ = fStack_34c + -0.16668057;
      local_2200._0_4_ = local_350 + -0.16668057;
      uStack_21f8._0_4_ = fStack_348 + -0.16668057;
      uStack_21f8._4_4_ = fStack_344 + -0.16668057;
      local_3c8 = local_2200;
      local_3d0 = local_2180;
      local_3d8 = ::_ps_cephes_log_p6;
      local_390 = local_2200;
      uStack_388 = uStack_21f8;
      local_3a0 = local_2180;
      uStack_398 = uStack_2178;
      local_3b0 = (local_350 + -0.16668057) * (float)local_20d0;
      fStack_3ac = (fStack_34c + -0.16668057) * local_20d0._4_4_;
      fStack_3a8 = (fStack_348 + -0.16668057) * (float)uStack_20c8;
      fStack_3a4 = (fStack_344 + -0.16668057) * uStack_20c8._4_4_;
      local_3c0[0] = 0.20000714;
      local_3c0[1] = 0.20000714;
      afStack_3b8[0] = 0.20000714;
      afStack_3b8[1] = 0.20000714;
      local_2200._4_4_ = fStack_3ac + 0.20000714;
      local_2200._0_4_ = local_3b0 + 0.20000714;
      uStack_21f8._0_4_ = fStack_3a8 + 0.20000714;
      uStack_21f8._4_4_ = fStack_3a4 + 0.20000714;
      local_428 = local_2200;
      local_430 = local_2180;
      local_438 = ::_ps_cephes_log_p7;
      local_3f0 = local_2200;
      uStack_3e8 = uStack_21f8;
      local_400 = local_2180;
      uStack_3f8 = uStack_2178;
      local_410 = (local_3b0 + 0.20000714) * (float)local_20d0;
      fStack_40c = (fStack_3ac + 0.20000714) * local_20d0._4_4_;
      fStack_408 = (fStack_3a8 + 0.20000714) * (float)uStack_20c8;
      fStack_404 = (fStack_3a4 + 0.20000714) * uStack_20c8._4_4_;
      local_420[0] = -0.24999994;
      local_420[1] = -0.24999994;
      afStack_418[0] = -0.24999994;
      afStack_418[1] = -0.24999994;
      local_2200._4_4_ = fStack_40c + -0.24999994;
      local_2200._0_4_ = local_410 + -0.24999994;
      uStack_21f8._0_4_ = fStack_408 + -0.24999994;
      uStack_21f8._4_4_ = fStack_404 + -0.24999994;
      local_488 = local_2200;
      local_490 = local_2180;
      local_498 = ::_ps_cephes_log_p8;
      local_450 = local_2200;
      uStack_448 = uStack_21f8;
      local_460 = local_2180;
      uStack_458 = uStack_2178;
      local_470 = (local_410 + -0.24999994) * (float)local_20d0;
      fStack_46c = (fStack_40c + -0.24999994) * local_20d0._4_4_;
      fStack_468 = (fStack_408 + -0.24999994) * (float)uStack_20c8;
      fStack_464 = (fStack_404 + -0.24999994) * uStack_20c8._4_4_;
      local_480[0] = 0.3333333;
      local_480[1] = 0.3333333;
      afStack_478[0] = 0.3333333;
      afStack_478[1] = 0.3333333;
      local_2200._4_4_ = fStack_46c + 0.3333333;
      local_2200._0_4_ = local_470 + 0.3333333;
      uStack_21f8._0_4_ = fStack_468 + 0.3333333;
      uStack_21f8._4_4_ = fStack_464 + 0.3333333;
      local_7d0 = local_2200;
      uStack_7c8 = uStack_21f8;
      local_7e0 = local_2180;
      uStack_7d8 = uStack_2178;
      local_2200._0_4_ = (local_470 + 0.3333333) * (float)local_20d0;
      local_2200._4_4_ = (fStack_46c + 0.3333333) * local_20d0._4_4_;
      fVar65 = (fStack_468 + 0.3333333) * (float)uStack_20c8;
      fVar66 = (fStack_464 + 0.3333333) * uStack_20c8._4_4_;
      uStack_21f8._0_4_ = fVar65;
      uStack_21f8._4_4_ = fVar66;
      local_7f0 = local_2200;
      uStack_7e8 = uStack_21f8;
      local_800 = CONCAT44(fStack_21ec,local_21f0);
      uStack_7f8 = CONCAT44(fStack_21e4,fStack_21e8);
      local_2200._0_4_ = (float)local_2200._0_4_ * local_21f0;
      local_2200._4_4_ = (float)local_2200._4_4_ * fStack_21ec;
      fVar65 = fVar65 * fStack_21e8;
      fVar66 = fVar66 * fStack_21e4;
      uStack_21f8._0_4_ = fVar65;
      uStack_21f8._4_4_ = fVar66;
      local_4e8 = local_21c0;
      local_4f0 = ::_ps_cephes_log_q1;
      local_4f8 = local_2200;
      local_4c0[0] = -0.00021219444;
      local_4c0[1] = -0.00021219444;
      afStack_4b8[0] = -0.00021219444;
      afStack_4b8[1] = -0.00021219444;
      local_4b0._0_4_ = local_21c0._0_4_;
      local_4b0._4_4_ = local_21c0._4_4_;
      uStack_4a8._0_4_ = local_21c0._8_4_;
      uStack_4a8._4_4_ = local_21c0._12_4_;
      local_4d0 = (float)local_4b0 * -0.00021219444;
      fStack_4cc = local_4b0._4_4_ * -0.00021219444;
      fStack_4c8 = (float)uStack_4a8 * -0.00021219444;
      fStack_4c4 = uStack_4a8._4_4_ * -0.00021219444;
      local_4e0 = local_2200;
      uStack_4d8 = uStack_21f8;
      local_2200._4_4_ = fStack_4cc + (float)local_2200._4_4_;
      local_2200._0_4_ = local_4d0 + (float)local_2200._0_4_;
      uStack_21f8._0_4_ = fStack_4c8 + fVar65;
      uStack_21f8._4_4_ = fStack_4c4 + fVar66;
      local_c8 = &local_21f0;
      local_d0 = ::_ps_0p5;
      local_d8 = local_2200;
      local_b0 = local_2200;
      uStack_a8 = uStack_21f8;
      local_90 = CONCAT44(fStack_21ec,local_21f0);
      uStack_88 = CONCAT44(fStack_21e4,fStack_21e8);
      local_a0[0] = 0.5;
      local_a0[1] = 0.5;
      afStack_98[0] = 0.5;
      afStack_98[1] = 0.5;
      local_c0 = local_21f0 * 0.5;
      fStack_bc = fStack_21ec * 0.5;
      fStack_b8 = fStack_21e8 * 0.5;
      fStack_b4 = fStack_21e4 * 0.5;
      auVar61._4_4_ = fStack_bc;
      auVar61._0_4_ = local_c0;
      auVar61._8_4_ = fStack_b8;
      auVar61._12_4_ = fStack_b4;
      _local_2200 = vsubps_avx(_local_2200,auVar61);
      local_20f0 = local_2180;
      uStack_20e8 = uStack_2178;
      local_2100._0_4_ = local_2200._0_4_;
      local_2100._4_4_ = local_2200._4_4_;
      uStack_20f8._0_4_ = local_2200._8_4_;
      uStack_20f8._4_4_ = local_2200._12_4_;
      local_2180._4_4_ = local_20d0._4_4_ + local_2100._4_4_;
      local_2180._0_4_ = (float)local_20d0 + (float)local_2100;
      uStack_2178._0_4_ = (float)uStack_20c8 + (float)uStack_20f8;
      uStack_2178._4_4_ = uStack_20c8._4_4_ + uStack_20f8._4_4_;
      local_548 = local_21c0;
      local_550 = ::_ps_cephes_log_q2;
      local_558 = local_2180;
      local_510 = local_21c0;
      uStack_508 = uStack_21b8;
      local_520[0] = 0.6933594;
      local_520[1] = 0.6933594;
      afStack_518[0] = 0.6933594;
      afStack_518[1] = 0.6933594;
      local_530 = (float)local_4b0 * 0.6933594;
      fStack_52c = local_4b0._4_4_ * 0.6933594;
      fStack_528 = (float)uStack_4a8 * 0.6933594;
      fStack_524 = uStack_4a8._4_4_ * 0.6933594;
      local_540 = local_2180;
      uStack_538 = uStack_2178;
      local_2180._4_4_ = fStack_52c + local_20d0._4_4_ + local_2100._4_4_;
      local_2180._0_4_ = local_530 + (float)local_20d0 + (float)local_2100;
      uStack_2178._0_4_ = fStack_528 + (float)uStack_20c8 + (float)uStack_20f8;
      uStack_2178._4_4_ = fStack_524 + uStack_20c8._4_4_ + uStack_20f8._4_4_;
      local_8d0 = local_2180;
      uStack_8c8 = uStack_2178;
      local_8e0 = local_21b0._0_8_;
      uStack_8d8 = local_21b0._8_8_;
      auVar55._8_8_ = uStack_2178;
      auVar55._0_8_ = local_2180;
      _local_2180 = vpor_avx(auVar55,local_21b0);
      local_2ba0 = auVar4._0_8_;
      local_2240 = local_2ba0;
      uStack_2b98 = auVar4._8_8_;
      uStack_2238 = uStack_2b98;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_2a20,auVar4);
      local_2bd0 = auVar4._0_8_;
      uStack_2bc8 = auVar4._8_8_;
      local_2090._0_4_ = auVar4._0_4_;
      local_2090._4_4_ = auVar4._4_4_;
      uStack_2088._0_4_ = auVar4._8_4_;
      uStack_2088._4_4_ = auVar4._12_4_;
      local_20a0._0_4_ = local_2180._0_4_;
      local_20a0._4_4_ = local_2180._4_4_;
      uStack_2098._0_4_ = local_2180._8_4_;
      uStack_2098._4_4_ = local_2180._12_4_;
      local_2b90 = CONCAT44(local_2090._4_4_ + local_20a0._4_4_,
                            (float)local_2090 + (float)local_20a0);
      uStack_2b88 = CONCAT44(uStack_2088._4_4_ + uStack_2098._4_4_,
                             (float)uStack_2088 + (float)uStack_2098);
      local_1eb8 = local_2a20;
      local_1ed0 = local_2b90;
      uStack_1ec8 = uStack_2b88;
      *(undefined8 *)*local_2a20 = local_2b90;
      *(undefined8 *)(*local_2a20 + 8) = uStack_2b88;
      local_2a20 = (undefined1 (*) [32])(*local_2a20 + 0x10);
      local_2230 = local_2250;
      uStack_2228 = uStack_2248;
      local_2210 = local_2250;
      uStack_2208 = uStack_2248;
      local_2100 = local_2200;
      uStack_20f8 = uStack_21f8;
      local_20e0 = local_21e0._0_8_;
      uStack_20d8 = local_21e0._8_8_;
      local_20d0 = uVar13;
      uStack_20c8 = uVar14;
      local_20b0 = uVar11;
      uStack_20a8 = uVar12;
      local_20a0 = local_2180;
      uStack_2098 = uStack_2178;
      local_2090 = local_2bd0;
      uStack_2088 = uStack_2bc8;
      local_2070 = 0x3f8000003f800000;
      uStack_2068 = 0x3f8000003f800000;
      local_2030 = local_21a0;
      uStack_2028 = uStack_2198;
      local_9d0 = local_c80;
      uStack_9c8 = uStack_c78;
      local_940 = auVar76._0_8_;
      local_900 = auVar76._0_8_;
      local_8c0 = local_1f70;
      uStack_8b8 = uStack_1f68;
      local_830 = local_840;
      uStack_828 = uStack_838;
      local_810 = uVar9;
      uStack_808 = uVar10;
      local_7b0 = local_7c0;
      uStack_7a8 = uStack_7b8;
      local_730 = local_798;
      local_728 = local_788;
      local_6d0 = local_798;
      local_6c8 = local_788;
      local_670 = local_798;
      local_668 = local_788;
      local_610 = local_798;
      local_608 = local_788;
      local_5b0 = local_798;
      local_5a8 = local_788;
      local_4b0 = local_21c0;
      uStack_4a8 = uStack_21b8;
      local_198 = local_798;
      local_138 = local_798;
      local_128 = local_188;
      local_f0 = local_2010;
      uStack_e8 = uStack_2008;
    }
    for (; local_2280 = auVar4, local_2a78 < local_2a10; local_2a78 = local_2a78 + 1) {
      if (*(float *)*local_2a20 <= 0.0) {
        fVar65 = expf(*(float *)*local_2a20);
        fVar65 = logf(fVar65 + 1.0);
        *(float *)*local_2a20 = fVar65;
      }
      else {
        fVar65 = *(float *)*local_2a20;
        fVar66 = expf(-*(float *)*local_2a20);
        fVar66 = logf(fVar66 + 1.0);
        *(float *)*local_2a20 = fVar65 + fVar66;
      }
      local_2a20 = (undefined1 (*) [32])(*local_2a20 + 4);
      auVar4 = local_2280;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}